

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  ImBitVector *this_00;
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ImWchar IVar7;
  undefined2 uVar8;
  uint uVar9;
  ImFont *pIVar10;
  ImFont *pIVar11;
  undefined8 *puVar12;
  ImFontConfig *pIVar13;
  long lVar14;
  char cVar15;
  char cVar20;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar39 [15];
  undefined1 auVar40 [14];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [14];
  undefined1 auVar45 [16];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  stbtt__buf fontdict;
  undefined1 auVar50 [15];
  unkuint9 Var51;
  undefined1 auVar52 [15];
  undefined1 auVar53 [13];
  undefined1 auVar54 [14];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [15];
  unkbyte10 Var58;
  uint6 uVar59;
  undefined1 auVar60 [14];
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  stbtt__active_edge **ppsVar64;
  bool bVar65;
  ushort uVar66;
  ushort uVar67;
  short sVar68;
  stbtt_uint32 sVar69;
  uint uVar77;
  int iVar78;
  int iVar79;
  void *p;
  ulong uVar80;
  stbtt_uint32 sVar70;
  stbtt_uint32 sVar71;
  stbtt_uint32 sVar72;
  stbtt_uint32 sVar73;
  stbtt_uint32 sVar74;
  stbtt_uint32 sVar75;
  stbtt_uint32 sVar76;
  int *piVar81;
  void *pvVar82;
  void *pvVar83;
  void *pvVar84;
  stbrp_context *ptr;
  uchar *puVar85;
  stbtt__buf *scanline;
  undefined1 auVar86 [8];
  undefined8 *puVar87;
  stbtt__active_edge *psVar88;
  stbtt__buf *psVar89;
  bool bVar90;
  short sVar91;
  uint uVar92;
  long lVar93;
  ImWchar *pIVar94;
  char *__function;
  int iVar95;
  ulong uVar96;
  long lVar97;
  bool bVar98;
  long lVar99;
  stbtt_fontinfo *psVar100;
  ImFontConfig *pIVar101;
  size_t sVar102;
  float fVar103;
  ushort *puVar104;
  stbtt__edge *psVar105;
  ulong uVar106;
  ulong uVar107;
  uint *ptr_00;
  stbrp_node **ppsVar108;
  byte *pbVar109;
  long lVar110;
  stbtt__edge *psVar111;
  uint uVar112;
  int iVar113;
  int iVar114;
  byte *pbVar115;
  ImFontAtlas *atlas_00;
  ImU32 bit_n;
  uint uVar116;
  long lVar117;
  byte bVar118;
  char cVar125;
  char cVar126;
  char cVar128;
  ushort uVar127;
  short sVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar130;
  uint uVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  uint uVar136;
  undefined1 auVar134 [16];
  uint uVar137;
  uint uVar141;
  undefined1 auVar138 [16];
  uint uVar142;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar143;
  uint uVar147;
  undefined1 in_XMM3 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  uint uVar148;
  undefined1 auVar146 [16];
  uint uVar149;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  int iVar159;
  float fVar160;
  float fVar165;
  uint uVar166;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar167;
  float fVar168;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  short sVar169;
  float fVar170;
  float fVar178;
  uint uVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar176 [16];
  float fVar182;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  short sVar189;
  uint uVar199;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  stbtt__buf sVar206;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  void *__s;
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  ImFontAtlas *local_478;
  ulong local_470;
  undefined1 local_468 [16];
  ImFontConfig *local_450;
  undefined1 local_448 [8];
  stbrp_node *local_440;
  stbtt__edge *local_438;
  float local_42c;
  ulong local_428;
  void *local_420;
  stbtt__active_edge *local_418;
  undefined8 local_410;
  int local_404;
  float local_400;
  uint local_3fc;
  undefined1 local_3f8 [8];
  void *pvStack_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d0;
  int local_3c8;
  float local_3c4;
  long local_3c0;
  stbtt_fontinfo *local_3b8;
  undefined8 *local_3b0;
  long local_3a8;
  void *pvStack_3a0;
  uchar *local_390;
  ulong local_388;
  ulong local_380;
  long local_378;
  float *local_370;
  int local_368;
  uint local_364;
  uint local_360;
  float local_35c;
  float local_358;
  int local_354;
  int local_350;
  int local_34c;
  undefined1 local_348 [16];
  stbrp_context *local_330;
  float *local_328;
  ulong local_320;
  ulong local_318;
  size_t local_310;
  ImFontConfig *local_308;
  long local_300;
  size_t local_2f8;
  size_t local_2f0;
  uchar *local_2e8;
  long local_2e0;
  short *local_2d8;
  long local_2d0;
  stbtt__edge *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined4 uVar171;
  undefined6 uVar172;
  undefined8 uVar173;
  undefined1 auVar174 [12];
  undefined1 auVar175 [14];
  undefined1 auVar177 [16];
  undefined4 uVar190;
  undefined6 uVar191;
  undefined8 uVar192;
  undefined1 auVar193 [12];
  undefined1 auVar194 [14];
  undefined1 auVar198 [16];
  
  local_3e8._8_8_ = local_3e8._0_8_;
  local_498._8_8_ = local_498._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                  ,0x826,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  __s = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar9 = (atlas->ConfigData).Size;
  lVar93 = (long)(int)uVar9;
  if (0 < lVar93) {
    uVar80 = 8;
    if (8 < uVar9) {
      uVar80 = (ulong)uVar9;
    }
    __s = ImGui::MemAlloc(uVar80 * 0x110);
  }
  uVar112 = (atlas->Fonts).Size;
  iVar78 = (int)uVar112 >> 0x1f;
  if ((int)uVar112 < 1) {
    local_498._0_8_ = (void *)0x0;
  }
  else {
    uVar80 = 8;
    if (8 < uVar112) {
      uVar80 = (ulong)uVar112;
    }
    local_498._0_8_ = ImGui::MemAlloc(uVar80 << 5);
  }
  local_310 = lVar93 * 0x110;
  memset(__s,0,local_310);
  local_3e8._0_8_ = CONCAT44(iVar78,uVar112) << 5;
  memset((void *)local_498._0_8_,0,local_3e8._0_8_);
  local_478 = atlas;
  if (0 < (atlas->ConfigData).Size) {
    uVar80 = 0;
    if (0 < (int)uVar9) {
      uVar80 = (ulong)uVar9;
    }
    local_348._0_8_ = uVar80;
    lVar110 = 0;
    pvVar84 = __s;
    do {
      if (lVar110 == local_348._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_0015233d;
      }
      pIVar101 = (local_478->ConfigData).Data;
      pIVar10 = pIVar101[lVar110].DstFont;
      if ((pIVar10 == (ImFont *)0x0) ||
         (pIVar10->ContainerAtlas != local_478 && pIVar10->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                      ,0x83e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)pvVar84 + lVar110 * 0x110 + 0xe0) = 0xffffffff;
      uVar80 = (ulong)(local_478->Fonts).Size;
      if ((long)uVar80 < 1) {
LAB_00152385:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                      ,0x845,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar101 = pIVar101 + lVar110;
      uVar96 = 0;
      while (pIVar11 = (local_478->Fonts).Data[uVar96], pIVar10 != pIVar11) {
        uVar96 = uVar96 + 1;
        if ((uVar80 <= uVar96) || (pIVar10 == pIVar11)) goto LAB_00152385;
      }
      *(int *)((long)pvVar84 + lVar110 * 0x110 + 0xe0) = (int)uVar96;
      pbVar115 = (byte *)pIVar101->FontData;
      iVar95 = pIVar101->FontNo;
      bVar118 = *pbVar115;
      local_450 = pIVar101;
      if (bVar118 < 0x4f) {
        if (bVar118 == 0) {
          if (pbVar115[1] != 1) goto LAB_0015241b;
        }
        else if ((bVar118 != 0x31) || (pbVar115[1] != 0)) goto LAB_0015241b;
        if ((pbVar115[2] != 0) || (pbVar115[3] != 0)) goto LAB_0015241b;
LAB_0014ee96:
        sVar76 = -(uint)(iVar95 != 0);
      }
      else {
        if (bVar118 == 0x4f) {
          if (((pbVar115[1] != 0x54) || (pbVar115[2] != 0x54)) || (pbVar115[3] != 0x4f))
          goto LAB_0015241b;
          goto LAB_0014ee96;
        }
        if (bVar118 != 0x74) goto LAB_0015241b;
        bVar118 = pbVar115[1];
        if (bVar118 == 0x72) {
          if ((pbVar115[2] != 0x75) || (pbVar115[3] != 0x65)) goto LAB_0015241b;
          goto LAB_0014ee96;
        }
        if (bVar118 != 0x74) {
          if (((bVar118 != 0x79) || (pbVar115[2] != 0x70)) || (pbVar115[3] != 0x31))
          goto LAB_0015241b;
          goto LAB_0014ee96;
        }
        if ((pbVar115[2] != 99) || (pbVar115[3] != 0x66)) goto LAB_0015241b;
        uVar77 = *(uint *)(pbVar115 + 4);
        uVar77 = uVar77 >> 0x18 | (uVar77 & 0xff0000) >> 8 | (uVar77 & 0xff00) << 8 | uVar77 << 0x18
        ;
        if (((uVar77 != 0x20000) && (uVar77 != 0x10000)) ||
           (uVar77 = *(uint *)(pbVar115 + 8),
           (int)(uVar77 >> 0x18 | (uVar77 & 0xff0000) >> 8 | (uVar77 & 0xff00) << 8 | uVar77 << 0x18
                ) <= iVar95)) goto LAB_0015241b;
        uVar77 = *(uint *)(pbVar115 + (long)iVar95 * 4 + 0xc);
        sVar76 = uVar77 >> 0x18 | (uVar77 & 0xff0000) >> 8 | (uVar77 & 0xff00) << 8 | uVar77 << 0x18
        ;
      }
      if ((int)sVar76 < 0) {
LAB_0015241b:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                      ,0x84b,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(byte **)((long)pvVar84 + lVar110 * 0x110 + 8) = pbVar115;
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x10) = sVar76;
      *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x48) = 0;
      __s = pvVar84;
      sVar69 = stbtt__find_table(pbVar115,sVar76,"cmap");
      sVar70 = stbtt__find_table(pbVar115,sVar76,"loca");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x18) = sVar70;
      sVar71 = stbtt__find_table(pbVar115,sVar76,"head");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x1c) = sVar71;
      sVar72 = stbtt__find_table(pbVar115,sVar76,"glyf");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x20) = sVar72;
      sVar73 = stbtt__find_table(pbVar115,sVar76,"hhea");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x24) = sVar73;
      sVar74 = stbtt__find_table(pbVar115,sVar76,"hmtx");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x28) = sVar74;
      sVar75 = stbtt__find_table(pbVar115,sVar76,"kern");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x2c) = sVar75;
      local_488._0_4_ = sVar76;
      sVar76 = stbtt__find_table(pbVar115,sVar76,"GPOS");
      *(stbtt_uint32 *)((long)pvVar84 + lVar110 * 0x110 + 0x30) = sVar76;
      if ((((sVar69 == 0) || (sVar71 == 0)) || (sVar73 == 0)) || (sVar74 == 0)) {
LAB_0014f6af:
        if ((void *)local_498._0_8_ != (void *)0x0) {
          ImGui::MemFree((void *)local_498._0_8_);
        }
        bVar65 = false;
        goto LAB_001522a8;
      }
      if (sVar72 == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffff00000000);
        local_410._0_4_ = 0;
        local_49c = 0;
        sVar76 = stbtt__find_table(pbVar115,local_488._0_4_,"CFF ");
        if (sVar76 != 0) {
          *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x90) = 0;
          *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x98) = 0;
          *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x80) = 0;
          *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x88) = 0;
          *(byte **)((long)pvVar84 + lVar110 * 0x110 + 0x40) = pbVar115 + sVar76;
          *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar84 + lVar110 * 0x110 + 0x40);
          local_238[0]._8_8_ = *(undefined8 *)((long)pvVar84 + lVar110 * 0x110 + 0x48);
          if (local_238[0].cursor < -2) goto LAB_00152504;
          uVar77 = local_238[0].cursor + 2;
          if (local_238[0].size < (int)uVar77) goto LAB_00152504;
          uVar116 = 0;
          if ((int)uVar77 < local_238[0].size) {
            uVar116 = (uint)local_238[0].data[uVar77];
          }
          if (local_238[0].size < (int)uVar116) goto LAB_00152504;
          local_238[0].cursor = uVar116;
          stbtt__cff_get_index(local_238);
          sVar206 = stbtt__cff_get_index(local_238);
          _local_3f8 = stbtt__cff_index_get(sVar206,0);
          stbtt__cff_get_index(local_238);
          sVar206 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar84 + lVar110 * 0x110 + 0x60) = sVar206;
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x11,1,(stbtt_uint32 *)local_448);
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x106,1,(stbtt_uint32 *)&local_3a8);
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x124,1,(stbtt_uint32 *)&local_410);
          stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x125,1,&local_49c);
          uVar173 = local_238[0]._8_8_;
          sVar206._4_12_ = in_stack_fffffffffffffb0c;
          sVar206.data._0_4_ = in_stack_fffffffffffffb08;
          fontdict.cursor = uVar112;
          fontdict.data = (uchar *)__s;
          fontdict.size = iVar78;
          sVar206 = stbtt__get_subrs(sVar206,fontdict);
          sVar76 = local_49c;
          *(stbtt__buf *)((long)pvVar84 + lVar110 * 0x110 + 0x70) = sVar206;
          if (((stbtt_uint32)local_3a8 == 2) && (uVar171 = local_448._0_4_, local_448._0_4_ != 0)) {
            iVar95 = SUB84(uVar173,4);
            if ((stbtt_uint32)local_410 != 0) {
              uVar80 = (ulong)local_49c;
              if (uVar80 == 0) goto LAB_0014f6af;
              if (((int)(stbtt_uint32)local_410 < 0) ||
                 (SUB84(uVar173,4) < (int)(stbtt_uint32)local_410)) goto LAB_00152504;
              local_238[0].cursor = (stbtt_uint32)local_410;
              sVar206 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar84 + lVar110 * 0x110 + 0x80) = sVar206;
              puVar85 = local_238[0].data + uVar80;
              lVar117 = (ulong)(local_238[0].size - sVar76) << 0x20;
              if ((int)(local_238[0].size - sVar76 | sVar76) < 0 || local_238[0].size < (int)sVar76)
              {
                puVar85 = (uchar *)0x0;
                lVar117 = 0;
              }
              *(uchar **)((long)pvVar84 + lVar110 * 0x110 + 0x90) = puVar85;
              *(long *)((long)pvVar84 + lVar110 * 0x110 + 0x98) = lVar117;
              iVar95 = local_238[0].size;
            }
            if (((int)uVar171 < 0) || (iVar95 < (int)uVar171)) {
LAB_00152504:
              __assert_fail("!(o > b->size || o < 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                            ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
            }
            local_238[0].cursor = uVar171;
            sVar206 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar84 + lVar110 * 0x110 + 0x50) = sVar206;
            goto LAB_0014f236;
          }
        }
        goto LAB_0014f6af;
      }
      if (sVar70 == 0) goto LAB_0014f6af;
LAB_0014f236:
      sVar76 = stbtt__find_table(pbVar115,local_488._0_4_,"maxp");
      if (sVar76 == 0) {
        uVar77 = 0xffff;
      }
      else {
        uVar77 = (uint)(ushort)(*(ushort *)(pbVar115 + (ulong)sVar76 + 4) << 8 |
                               *(ushort *)(pbVar115 + (ulong)sVar76 + 4) >> 8);
      }
      *(uint *)((long)pvVar84 + lVar110 * 0x110 + 0x14) = uVar77;
      uVar66 = *(ushort *)(pbVar115 + (ulong)sVar69 + 2) << 8 |
               *(ushort *)(pbVar115 + (ulong)sVar69 + 2) >> 8;
      *(undefined4 *)((long)pvVar84 + lVar110 * 0x110 + 0x34) = 0;
      if (uVar66 == 0) goto LAB_0014f6af;
      uVar77 = sVar69 + 4;
      uVar80 = (ulong)uVar66;
      iVar95 = 0;
      do {
        uVar66 = *(ushort *)(pbVar115 + uVar77) << 8 | *(ushort *)(pbVar115 + uVar77) >> 8;
        if ((uVar66 == 0) ||
           ((uVar66 == 3 &&
            ((uVar66 = *(ushort *)(pbVar115 + (ulong)uVar77 + 2) << 8 |
                       *(ushort *)(pbVar115 + (ulong)uVar77 + 2) >> 8, uVar66 == 10 || (uVar66 == 1)
             ))))) {
          uVar116 = *(uint *)(pbVar115 + (ulong)uVar77 + 4);
          iVar95 = (uVar116 >> 0x18 | (uVar116 & 0xff0000) >> 8 | (uVar116 & 0xff00) << 8 |
                   uVar116 << 0x18) + sVar69;
          *(int *)((long)pvVar84 + lVar110 * 0x110 + 0x34) = iVar95;
        }
        uVar77 = uVar77 + 8;
        uVar80 = uVar80 - 1;
      } while (uVar80 != 0);
      if (iVar95 == 0) goto LAB_0014f6af;
      *(uint *)((long)pvVar84 + lVar110 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (pbVar115 + (long)*(int *)((long)pvVar84 + lVar110 * 0x110 + 0x1c) + 0x32
                           ) << 8 |
                         *(ushort *)
                          (pbVar115 + (long)*(int *)((long)pvVar84 + lVar110 * 0x110 + 0x1c) + 0x32)
                         >> 8);
      iVar95 = *(int *)((long)pvVar84 + lVar110 * 0x110 + 0xe0);
      if (((long)iVar95 < 0) || ((int)uVar112 <= iVar95)) goto LAB_00152478;
      pIVar94 = local_450->GlyphRanges;
      if (pIVar94 == (ImWchar *)0x0) {
        pIVar94 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar84 + lVar110 * 0x110 + 0xd8) = pIVar94;
      IVar7 = *pIVar94;
      while (IVar7 != 0) {
        uVar66 = pIVar94[1];
        if (uVar66 == 0) break;
        uVar77 = *(uint *)((long)pvVar84 + lVar110 * 0x110 + 0xe4);
        uVar116 = (uint)uVar66;
        if ((int)(uint)uVar66 < (int)uVar77) {
          uVar116 = uVar77;
        }
        *(uint *)((long)pvVar84 + lVar110 * 0x110 + 0xe4) = uVar116;
        IVar7 = pIVar94[2];
        pIVar94 = pIVar94 + 2;
      }
      piVar81 = (int *)((long)iVar95 * 0x20 + local_498._0_8_);
      *piVar81 = *piVar81 + 1;
      iVar95 = *(int *)((long)pvVar84 + lVar110 * 0x110 + 0xe4);
      if (iVar95 < piVar81[1]) {
        iVar95 = piVar81[1];
      }
      piVar81[1] = iVar95;
      lVar110 = lVar110 + 1;
      pvVar84 = __s;
    } while (lVar110 < (local_478->ConfigData).Size);
  }
  auVar86 = (undefined1  [8])0;
  if (0 < (int)uVar9) {
    lVar110 = 0;
    auVar86 = (undefined1  [8])0;
    pvVar84 = __s;
    do {
      lVar117 = lVar110 * 0x110;
      iVar78 = *(int *)((long)pvVar84 + lVar117 + 0xe0);
      if (((long)iVar78 < 0) || ((int)uVar112 <= iVar78)) goto LAB_00152478;
      local_488 = auVar86;
      this_00 = (ImBitVector *)((long)pvVar84 + lVar117 + 0xf0);
      __s = pvVar84;
      ImBitVector::Create(this_00,*(int *)((long)pvVar84 + lVar117 + 0xe4) + 1);
      lVar99 = (long)iVar78 * 0x20 + local_498._0_8_;
      this = (ImBitVector *)(lVar99 + 0x10);
      if (*(int *)(lVar99 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)(lVar99 + 4) + 1);
      }
      puVar104 = *(ushort **)((long)pvVar84 + lVar117 + 0xd8);
      uVar66 = *puVar104;
      for (; (uVar66 != 0 && (puVar104[1] != 0)); puVar104 = puVar104 + 2) {
        if (uVar66 <= puVar104[1]) {
          uVar77 = (uint)uVar66;
          do {
            bVar65 = ImBitVector::TestBit(this,uVar77);
            if ((!bVar65) &&
               (iVar78 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar84 + lVar117 + 8),
                                    *(int *)((long)pvVar84 + lVar117 + 0x34)), iVar78 != 0)) {
              piVar81 = (int *)((long)pvVar84 + lVar117 + 0xe8);
              *piVar81 = *piVar81 + 1;
              *(int *)(lVar99 + 8) = *(int *)(lVar99 + 8) + 1;
              ImBitVector::SetBit(this_00,uVar77);
              ImBitVector::SetBit(this,uVar77);
              auVar131 = _local_488;
              iVar78 = local_488._0_4_;
              local_488._4_4_ = 0;
              local_488._0_4_ = iVar78 + 1;
              _fStack_480 = auVar131._8_8_;
            }
            bVar65 = uVar77 < puVar104[1];
            uVar77 = uVar77 + 1;
          } while (bVar65);
        }
        uVar66 = puVar104[2];
      }
      lVar110 = lVar110 + 1;
      auVar86 = local_488;
      pvVar84 = __s;
    } while (lVar110 != lVar93);
    if (0 < (int)uVar9) {
      lVar110 = 0;
      do {
        lVar117 = lVar110 * 0x110;
        iVar78 = *(int *)((long)pvVar84 + lVar117 + 0xe8);
        __s = pvVar84;
        if (*(int *)((long)pvVar84 + lVar117 + 0x104) < iVar78) {
          pvVar82 = ImGui::MemAlloc((long)iVar78 << 2);
          pvVar83 = *(void **)((long)pvVar84 + lVar117 + 0x108);
          if (pvVar83 != (void *)0x0) {
            memcpy(pvVar82,pvVar83,(long)*(int *)((long)pvVar84 + lVar117 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)pvVar84 + lVar117 + 0x108));
          }
          *(void **)((long)pvVar84 + lVar117 + 0x108) = pvVar82;
          *(int *)((long)pvVar84 + lVar117 + 0x104) = iVar78;
        }
        lVar99 = (long)*(int *)((long)pvVar84 + lVar117 + 0xf0);
        ptr_00 = *(uint **)((long)pvVar84 + lVar117 + 0xf8);
        if (0 < lVar99) {
          puVar1 = ptr_00 + lVar99;
          iVar78 = 0;
          do {
            uVar77 = *ptr_00;
            if (uVar77 != 0) {
              uVar116 = 0;
              do {
                if ((uVar77 >> (uVar116 & 0x1f) & 1) != 0) {
                  iVar95 = *(int *)((long)pvVar84 + lVar117 + 0x100);
                  if (iVar95 == *(int *)((long)pvVar84 + lVar117 + 0x104)) {
                    if (iVar95 == 0) {
                      iVar79 = 8;
                    }
                    else {
                      iVar79 = iVar95 / 2 + iVar95;
                    }
                    iVar159 = iVar95 + 1;
                    if (iVar95 + 1 < iVar79) {
                      iVar159 = iVar79;
                    }
                    pvVar83 = ImGui::MemAlloc((long)iVar159 << 2);
                    pvVar82 = *(void **)((long)pvVar84 + lVar117 + 0x108);
                    if (pvVar82 != (void *)0x0) {
                      memcpy(pvVar83,pvVar82,(long)*(int *)((long)pvVar84 + lVar117 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar84 + lVar117 + 0x108));
                    }
                    *(void **)((long)pvVar84 + lVar117 + 0x108) = pvVar83;
                    *(int *)((long)pvVar84 + lVar117 + 0x104) = iVar159;
                    iVar95 = *(int *)((long)pvVar84 + lVar117 + 0x100);
                  }
                  else {
                    pvVar83 = *(void **)((long)pvVar84 + lVar117 + 0x108);
                  }
                  *(uint *)((long)pvVar83 + (long)iVar95 * 4) = iVar78 + uVar116;
                  piVar81 = (int *)((long)pvVar84 + lVar117 + 0x100);
                  *piVar81 = *piVar81 + 1;
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != 0x20);
            }
            ptr_00 = ptr_00 + 1;
            iVar78 = iVar78 + 0x20;
          } while (ptr_00 < puVar1);
          ptr_00 = *(uint **)((long)pvVar84 + lVar117 + 0xf8);
        }
        if (ptr_00 != (uint *)0x0) {
          *(undefined8 *)((long)pvVar84 + lVar117 + 0xf0) = 0;
          ImGui::MemFree(ptr_00);
          *(undefined8 *)((long)pvVar84 + lVar117 + 0xf8) = 0;
        }
        if (*(int *)((long)pvVar84 + lVar117 + 0x100) != *(int *)((long)pvVar84 + lVar117 + 0xe8)) {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                        ,0x87a,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        lVar110 = lVar110 + 1;
        pvVar84 = __s;
      } while (lVar110 != lVar93);
      auVar86 = local_488;
    }
  }
  atlas_00 = local_478;
  uVar173 = local_498._0_8_;
  if ((int)uVar112 < 1) {
    if (local_498._0_8_ == 0) goto LAB_0014f71e;
  }
  else {
    lVar110 = 0;
    do {
      pvVar84 = *(void **)(uVar173 + 0x18 + lVar110);
      if (pvVar84 != (void *)0x0) {
        *(undefined8 *)(uVar173 + 0x10 + lVar110) = 0;
        ImGui::MemFree(pvVar84);
        *(undefined8 *)(uVar173 + 0x18 + lVar110) = 0;
      }
      lVar110 = lVar110 + 0x20;
    } while (local_3e8._0_8_ != lVar110);
  }
  ImGui::MemFree((void *)local_498._0_8_);
LAB_0014f71e:
  _local_3f8 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  uVar112 = SUB84(auVar86,0);
  if ((int)uVar112 < 1) {
    local_3f8._0_4_ = uVar112;
    pvVar84 = (void *)0x0;
  }
  else {
    uVar80 = 8;
    if (8 < uVar112) {
      uVar80 = (ulong)auVar86 & 0xffffffff;
    }
    pvVar84 = ImGui::MemAlloc(uVar80 << 4);
    pvStack_3f0 = pvVar84;
    local_3f8._4_4_ = (int)uVar80;
    uVar80 = 8;
    if (8 < uVar112) {
      uVar80 = (ulong)auVar86 & 0xffffffff;
    }
    local_3f8._0_4_ = uVar112;
    pvStack_3a0 = ImGui::MemAlloc(uVar80 * 0x1c);
    local_3a8 = uVar80 << 0x20;
  }
  pvVar83 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar112);
  iVar78 = 0;
  memset(pvVar84,0,(long)(int)(uVar112 << 4));
  local_498._0_8_ = pvVar83;
  memset(pvVar83,0,(long)(int)(uVar112 * 0x1c));
  if ((int)uVar9 < 1) {
    fVar130 = 0.0;
  }
  else {
    lVar110 = 0;
    uVar80 = 0;
    uVar112 = 0;
    local_488 = auVar86;
    lVar117 = local_498._0_8_;
    do {
      iVar79 = (int)uVar80;
      iVar95 = *(int *)((long)__s + lVar110 * 0x110 + 0xe8);
      if (iVar95 != 0) {
        if ((iVar79 < 0) || (SUB84(auVar86,0) <= iVar79)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_0015233d;
        }
        psVar100 = (stbtt_fontinfo *)(lVar110 * 0x110 + (long)__s);
        *(void **)&psVar100[1].hmtx = (void *)(uVar80 * 0x10 + (long)pvVar84);
        if (((int)uVar112 < 0) || (SUB84(auVar86,0) <= (int)uVar112)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_0015233d;
        }
        lVar99 = (ulong)uVar112 * 0x1c + lVar117;
        *(long *)&psVar100[1].gpos = lVar99;
        if ((atlas_00->ConfigData).Size <= lVar110) goto LAB_001523e2;
        pIVar101 = (atlas_00->ConfigData).Data;
        fVar130 = pIVar101[lVar110].SizePixels;
        *(float *)&psVar100[1].userdata = fVar130;
        *(undefined4 *)((long)&psVar100[1].userdata + 4) = 0;
        psVar100[1].data = *(uchar **)&psVar100[1].gsubrs.cursor;
        uVar77 = *(uint *)&psVar100[1].gsubrs.data;
        uVar96 = (ulong)uVar77;
        psVar100[1].fontstart = uVar77;
        *(long *)&psVar100[1].loca = lVar99;
        *(char *)&psVar100[1].glyf = (char)pIVar101[lVar110].OversampleH;
        *(char *)((long)&psVar100[1].glyf + 1) = (char)pIVar101[lVar110].OversampleV;
        if (fVar130 <= 0.0) {
          fVar130 = -fVar130;
          uVar116 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                  *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar85 = psVar100->data;
          lVar117 = (long)psVar100->hhea;
          uVar116 = ((int)(short)((ushort)puVar85[lVar117 + 4] << 8) | (uint)puVar85[lVar117 + 5]) -
                    ((int)(short)((ushort)puVar85[lVar117 + 6] << 8) | (uint)puVar85[lVar117 + 7]);
          lVar117 = local_498._0_8_;
        }
        fVar130 = fVar130 / (float)(int)uVar116;
        uVar80 = (ulong)(uint)(iVar79 + iVar95);
        uVar112 = uVar112 + iVar95;
        if (0 < (int)uVar77) {
          local_3e8._0_4_ = iVar79 + iVar95;
          uVar171 = (undefined4)lVar110;
          uVar190 = (undefined4)((ulong)lVar110 >> 0x20);
          iVar95 = atlas_00->TexGlyphPadding;
          lVar99 = 6;
          lVar117 = 0;
          do {
            if ((int)uVar96 <= lVar117) goto LAB_00152328;
            iVar79 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
            if (iVar79 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                            ,0x8a9,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar100,iVar79,(float)pIVar101[lVar110].OversampleH * fVar130,
                       (float)pIVar101[lVar110].OversampleV * fVar130,fVar130,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_448,(int *)&local_410,(int *)&local_49c);
            uVar77 = (pIVar101[lVar110].OversampleH +
                     (((stbtt_uint32)local_410 + iVar95) - (int)local_238[0].data)) - 1;
            lVar97 = *(long *)&psVar100[1].hmtx;
            *(short *)(lVar97 + -2 + lVar99) = (short)uVar77;
            uVar116 = (pIVar101[lVar110].OversampleV + ((local_49c + iVar95) - local_448._0_4_)) - 1
            ;
            *(short *)(lVar97 + lVar99) = (short)uVar116;
            iVar78 = iVar78 + (uVar116 & 0xffff) * (uVar77 & 0xffff);
            lVar117 = lVar117 + 1;
            uVar96 = (ulong)*(int *)&psVar100[1].gsubrs.data;
            lVar99 = lVar99 + 0x10;
          } while (lVar117 < (long)uVar96);
          lVar110 = CONCAT44(uVar190,uVar171);
          uVar80 = (ulong)(uint)local_3e8._0_4_;
          lVar117 = local_498._0_8_;
          atlas_00 = local_478;
          auVar86 = local_488;
        }
      }
      lVar110 = lVar110 + 1;
    } while (lVar110 != lVar93);
    fVar130 = (float)iVar78;
  }
  atlas_00->TexHeight = 0;
  fVar103 = (float)atlas_00->TexDesiredWidth;
  if ((int)fVar103 < 1) {
    iVar78 = (int)SQRT(fVar130);
    fVar103 = 5.73972e-42;
    if ((iVar78 < 0xb33) && (fVar103 = 2.86986e-42, iVar78 < 0x599)) {
      fVar103 = (float)((uint)(0x2cb < iVar78) * 0x200 + 0x200);
    }
  }
  atlas_00->TexWidth = (int)fVar103;
  uVar112 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar77 = (int)fVar103 - uVar112;
  local_440 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar77 << 4);
  auVar203 = _DAT_001a54f0;
  auVar131 = _DAT_0019c8b0;
  if ((ptr == (stbrp_context *)0x0) || (local_440 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_440 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_440);
    }
    local_440 = (stbrp_node *)0x0;
    uVar112 = 0;
    fVar103 = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar112 < -0x7fff) || (0xffff < (int)uVar77)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar80 = (ulong)(uVar77 - 1);
    if ((int)uVar77 < 2) {
      uVar80 = 0;
    }
    else {
      uVar96 = (ulong)(uVar77 & 0x7ffffffe);
      lVar110 = uVar80 - 1;
      auVar119._8_4_ = (int)lVar110;
      auVar119._0_8_ = lVar110;
      auVar119._12_4_ = (int)((ulong)lVar110 >> 0x20);
      ppsVar108 = &local_440[1].next;
      auVar119 = auVar119 ^ _DAT_0019c8b0;
      auVar144._8_4_ = 0xffffffff;
      auVar144._0_8_ = 0xffffffffffffffff;
      auVar144._12_4_ = 0xffffffff;
      auVar133 = _DAT_0019c8a0;
      do {
        auVar150 = auVar133 ^ auVar131;
        auVar161._0_4_ = -(uint)(auVar119._0_4_ < auVar150._0_4_);
        auVar161._4_4_ = -(uint)(auVar119._4_4_ < auVar150._4_4_);
        auVar161._8_4_ = -(uint)(auVar119._8_4_ < auVar150._8_4_);
        auVar161._12_4_ = -(uint)(auVar119._12_4_ < auVar150._12_4_);
        auVar151._4_4_ = -(uint)(auVar150._4_4_ == auVar119._4_4_);
        auVar151._12_4_ = -(uint)(auVar150._12_4_ == auVar119._12_4_);
        auVar151._0_4_ = auVar151._4_4_;
        auVar151._8_4_ = auVar151._12_4_;
        auVar150._4_4_ = auVar161._4_4_;
        auVar150._0_4_ = auVar161._4_4_;
        auVar150._8_4_ = auVar161._12_4_;
        auVar150._12_4_ = auVar161._12_4_;
        auVar150 = auVar150 | auVar151 & auVar161;
        lVar110 = auVar133._8_8_;
        if ((~auVar150._0_4_ & 1) != 0) {
          ppsVar108[-2] = local_440 + auVar133._0_8_ + 1;
        }
        if (((auVar150 ^ auVar144) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar108 = local_440 + (lVar110 - auVar144._8_8_);
        }
        auVar133._0_8_ = auVar133._0_8_ + auVar203._0_8_;
        auVar133._8_8_ = lVar110 + auVar203._8_8_;
        ppsVar108 = ppsVar108 + 4;
        uVar96 = uVar96 - 2;
      } while (uVar96 != 0);
    }
    local_440[uVar80].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_440;
    ptr->active_head = ptr->extra;
    ptr->width = uVar77;
    ptr->height = 0x8000 - uVar112;
    ptr->num_nodes = uVar77;
    ptr->align = (int)((uVar77 - 1) + uVar77) / (int)uVar77;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar77;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_330 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if (0 < (int)uVar9) {
    lVar110 = 0;
    pvVar84 = __s;
    do {
      lVar117 = lVar110 * 0x110;
      iVar78 = *(int *)((long)pvVar84 + lVar117 + 0xe8);
      __s = pvVar84;
      if (iVar78 != 0) {
        stbrp_pack_rects(local_330,*(stbrp_rect **)((long)pvVar84 + lVar117 + 200),iVar78);
        lVar99 = (long)*(int *)((long)pvVar84 + lVar117 + 0xe8);
        if (0 < lVar99) {
          lVar117 = *(long *)((long)pvVar84 + lVar117 + 200);
          lVar97 = 0;
          do {
            if (*(int *)(lVar117 + 0xc + lVar97) != 0) {
              iVar78 = (uint)*(ushort *)(lVar117 + 6 + lVar97) +
                       (uint)*(ushort *)(lVar117 + 10 + lVar97);
              if (iVar78 < atlas_00->TexHeight) {
                iVar78 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar78;
            }
            lVar97 = lVar97 + 0x10;
          } while (lVar99 * 0x10 != lVar97);
        }
      }
      lVar110 = lVar110 + 1;
      pvVar84 = __s;
    } while (lVar110 != lVar93);
  }
  uVar77 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar77 = (int)(uVar77 - 1) >> 1 | uVar77 - 1;
    uVar77 = (int)uVar77 >> 2 | uVar77;
    uVar77 = (int)uVar77 >> 4 | uVar77;
    uVar77 = (int)uVar77 >> 8 | uVar77;
    uVar77 = (int)uVar77 >> 0x10 | uVar77;
  }
  iVar78 = uVar77 + 1;
  atlas_00->TexHeight = iVar78;
  auVar131._0_4_ = (float)atlas_00->TexWidth;
  auVar131._4_4_ = (float)iVar78;
  auVar131._8_8_ = 0;
  auVar131 = divps(_DAT_0019c8f0,auVar131);
  atlas_00->TexUvScale = auVar131._0_8_;
  puVar85 = (uchar *)ImGui::MemAlloc((long)(iVar78 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar85;
  local_42c = fVar103;
  memset(puVar85,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < (int)uVar9) {
    local_390 = atlas_00->TexPixelsAlpha8;
    lVar117 = (long)(int)local_42c;
    local_298 = pshuflw(ZEXT416(uVar112),ZEXT416(uVar112),0);
    lVar110 = 0;
    auVar131 = _DAT_001a55b0;
    do {
      auVar203 = _local_488;
      local_3c0 = lVar110;
      if ((atlas_00->ConfigData).Size <= lVar110) goto LAB_001523e2;
      if (*(int *)((long)__s + lVar110 * 0x110 + 0xe8) != 0) {
        psVar100 = (stbtt_fontinfo *)(lVar110 * 0x110 + (long)__s);
        fVar130 = *(float *)&psVar100[1].userdata;
        auVar152 = ZEXT416((uint)fVar130);
        if (fVar130 <= 0.0) {
          auVar152._0_4_ = -fVar130;
          auVar152._4_4_ = 0x80000000;
          auVar152._8_4_ = 0x80000000;
          auVar152._12_4_ = 0x80000000;
          uVar112 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                  *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar85 = psVar100->data;
          lVar110 = (long)psVar100->hhea;
          uVar112 = ((int)(short)((ushort)puVar85[lVar110 + 4] << 8) | (uint)puVar85[lVar110 + 5]) -
                    ((int)(short)((ushort)puVar85[lVar110 + 6] << 8) | (uint)puVar85[lVar110 + 7]);
        }
        auVar153._4_12_ = auVar152._4_12_;
        auVar153._0_4_ = auVar152._0_4_ / (float)(int)uVar112;
        local_308 = (atlas_00->ConfigData).Data;
        iVar78 = psVar100[1].fontstart;
        if (0 < iVar78) {
          lVar110._0_4_ = psVar100[1].hmtx;
          lVar110._4_4_ = psVar100[1].kern;
          uVar80._0_4_ = psVar100[1].glyf;
          uVar80._4_4_ = psVar100[1].hhea;
          auVar39._8_6_ = 0;
          auVar39._0_8_ = uVar80;
          auVar39[0xe] = (char)((uint)uVar80._4_4_ >> 0x18);
          auVar41._8_4_ = 0;
          auVar41._0_8_ = uVar80;
          auVar41[0xc] = (char)((uint)uVar80._4_4_ >> 0x10);
          auVar41._13_2_ = auVar39._13_2_;
          auVar42._8_4_ = 0;
          auVar42._0_8_ = uVar80;
          auVar42._12_3_ = auVar41._12_3_;
          auVar43._8_2_ = 0;
          auVar43._0_8_ = uVar80;
          auVar43[10] = (char)((uint)uVar80._4_4_ >> 8);
          auVar43._11_4_ = auVar42._11_4_;
          auVar46._8_2_ = 0;
          auVar46._0_8_ = uVar80;
          auVar46._10_5_ = auVar43._10_5_;
          auVar47[8] = (char)uVar80._4_4_;
          auVar47._0_8_ = uVar80;
          auVar47._9_6_ = auVar46._9_6_;
          auVar50._7_8_ = 0;
          auVar50._0_7_ = auVar47._8_7_;
          cVar128 = (char)((uint)(undefined4)uVar80 >> 0x18);
          Var51 = CONCAT81(SUB158(auVar50 << 0x40,7),cVar128);
          auVar57._9_6_ = 0;
          auVar57._0_9_ = Var51;
          cVar126 = (char)((uint)(undefined4)uVar80 >> 0x10);
          auVar48[4] = cVar126;
          auVar48._0_4_ = (undefined4)uVar80;
          auVar48._5_10_ = SUB1510(auVar57 << 0x30,5);
          auVar52._11_4_ = 0;
          auVar52._0_11_ = auVar48._4_11_;
          cVar125 = (char)((uint)(undefined4)uVar80 >> 8);
          auVar53._1_12_ = SUB1512(auVar52 << 0x20,3);
          auVar53[0] = cVar125;
          bVar118 = (byte)(undefined4)uVar80;
          uVar66 = CONCAT11(0,bVar118);
          auVar49._2_13_ = auVar53;
          auVar49._0_2_ = uVar66;
          uVar127 = auVar53._0_2_;
          sVar91 = -auVar48._4_2_;
          sVar129 = (short)Var51;
          sVar68 = -sVar129;
          local_470 = (ulong)uVar127;
          auVar40._10_2_ = 0;
          auVar40._0_10_ = auVar49._0_10_;
          auVar40._12_2_ = sVar129;
          uVar59 = CONCAT42(auVar40._10_4_,auVar48._4_2_);
          auVar54._6_8_ = 0;
          auVar54._0_6_ = uVar59;
          auVar44._4_2_ = uVar127;
          auVar44._0_4_ = auVar49._0_4_;
          auVar44._6_8_ = SUB148(auVar54 << 0x40,6);
          auVar120._0_4_ = (float)uVar66;
          auVar120._4_4_ = (float)auVar44._4_4_;
          auVar120._8_4_ = (float)(int)uVar59;
          auVar120._12_4_ = (float)(auVar40._10_4_ >> 0x10);
          local_268 = divps(_DAT_0019c8f0,auVar120);
          auVar162[0] = -(bVar118 == 0);
          auVar162[1] = -(bVar118 == 0);
          auVar162[2] = -(bVar118 == 0);
          auVar162[3] = -(bVar118 == 0);
          auVar162[4] = -(cVar125 == '\0');
          auVar162[5] = -(cVar125 == '\0');
          auVar162[6] = -(cVar125 == '\0');
          auVar162[7] = -(cVar125 == '\0');
          auVar162[8] = -(cVar126 == '\0');
          auVar162[9] = -(cVar126 == '\0');
          auVar162[10] = -(cVar126 == '\0');
          auVar162[0xb] = -(cVar126 == '\0');
          auVar162[0xc] = -(cVar128 == '\0');
          auVar162[0xd] = -(cVar128 == '\0');
          auVar162[0xe] = -(cVar128 == '\0');
          auVar162[0xf] = -(cVar128 == '\0');
          Var58 = CONCAT64(CONCAT42(CONCAT22(sVar68,sVar68),sVar91),CONCAT22(sVar91,sVar68));
          auVar55._4_8_ = (long)((unkuint10)Var58 >> 0x10);
          auVar55._2_2_ = 1 - uVar127;
          auVar55._0_2_ = 1 - uVar127;
          auVar132._0_4_ = (float)(int)(short)(1 - uVar66);
          auVar132._4_4_ = (float)(auVar55._0_4_ >> 0x10);
          auVar132._8_4_ = (float)((int)((unkuint10)Var58 >> 0x10) >> 0x10);
          auVar132._12_4_ = (float)(int)sVar68;
          auVar145._0_4_ = auVar153._0_4_ * auVar120._0_4_;
          auVar145._4_4_ = auVar153._0_4_ * auVar120._4_4_;
          auVar145._8_4_ = auVar153._0_4_ * auVar120._8_4_;
          auVar145._12_4_ = auVar153._0_4_ * auVar120._12_4_;
          auVar121._0_4_ = auVar120._0_4_ + auVar120._0_4_;
          auVar121._4_4_ = auVar120._4_4_ + auVar120._4_4_;
          auVar121._8_4_ = auVar120._8_4_ + auVar120._8_4_;
          auVar121._12_4_ = auVar120._12_4_ + auVar120._12_4_;
          auVar133 = divps(auVar132,auVar121);
          fVar130 = auVar145._4_4_;
          if (auVar145._0_4_ <= auVar145._4_4_) {
            fVar130 = auVar145._0_4_;
          }
          local_3c4 = (0.35 / fVar130) * (0.35 / fVar130);
          local_2b8 = auVar145._4_4_;
          fStack_2b4 = auVar145._4_4_;
          fStack_2b0 = auVar145._4_4_;
          fStack_2ac = auVar145._4_4_;
          local_318 = (ulong)((undefined4)uVar80 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar80 >> 8 & 0xff);
          local_278._4_4_ = local_268._4_4_;
          local_278._0_4_ = local_278._4_4_;
          local_278._8_4_ = local_278._4_4_;
          local_278._12_4_ = local_278._4_4_;
          local_258 = ~auVar162 & auVar133;
          local_288._4_4_ = SUB164(~auVar162 & auVar133,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_488._4_4_ = 0;
          local_488._0_4_ = auVar49._0_4_ & 0xff;
          _fStack_480 = auVar203._8_8_;
          local_2a8 = auVar145;
          uVar80 = CONCAT44(auVar145._4_4_,auVar145._0_4_);
          local_248 = uVar80 ^ 0x8000000000000000;
          fStack_240 = auVar145._0_4_;
          fStack_23c = -auVar145._4_4_;
          lVar99 = 0;
          local_3b8 = psVar100;
          local_2e0 = lVar110;
          local_468 = auVar153;
          do {
            if (((*(int *)(lVar110 + 0xc + lVar99 * 0x10) != 0) &&
                (lVar97 = lVar99 * 0x10 + lVar110, *(short *)(lVar97 + 4) != 0)) &&
               (*(short *)(lVar97 + 6) != 0)) {
              local_2d8 = (short *)(lVar99 * 0x1c + *(long *)&psVar100[1].loca);
              local_2d0 = lVar99;
              iVar95 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
              uVar173 = *(undefined8 *)(lVar97 + 4);
              *(ulong *)(lVar97 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar173 >> 0x30) + local_298._6_2_,
                                     (short)((ulong)uVar173 >> 0x20) + local_298._4_2_),
                            CONCAT22((short)((ulong)uVar173 >> 0x10) - local_298._2_2_,
                                     (short)uVar173 - local_298._0_2_));
              puVar85 = psVar100->data;
              uVar66 = *(ushort *)(puVar85 + (long)psVar100->hhea + 0x22) << 8 |
                       *(ushort *)(puVar85 + (long)psVar100->hhea + 0x22) >> 8;
              iVar78 = psVar100->hmtx;
              lVar110 = (ulong)uVar66 * 4 + (long)iVar78 + -4;
              lVar99 = (ulong)uVar66 * 4 + (long)iVar78 + -3;
              if (iVar95 < (int)(uint)uVar66) {
                lVar110 = (long)(iVar95 * 4) + (long)iVar78;
                lVar99 = (long)(iVar95 * 4) + 1 + (long)iVar78;
              }
              local_364 = (uint)puVar85[lVar99];
              local_360 = (uint)puVar85[lVar110];
              auVar131 = local_298;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar100,iVar95,(float)local_2a8._0_4_,local_2b8,local_298._0_4_,
                         auVar145._0_4_,&local_350,&local_354,&local_2bc,&local_2c0);
              fVar130 = auVar131._0_4_;
              uVar66 = *(ushort *)(lVar97 + 8);
              uVar127 = *(ushort *)(lVar97 + 10);
              local_428 = (ulong)*(ushort *)(lVar97 + 4);
              local_3d0 = (ulong)*(ushort *)(lVar97 + 6);
              local_378 = lVar97;
              uVar112 = stbtt_GetGlyphShape(psVar100,iVar95,(stbtt_vertex **)&local_410);
              uVar77 = ((int)local_428 - local_488._0_4_) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3b8,iVar95,(float)local_2a8._0_4_,local_2b8,fVar130,auVar145._0_4_,
                         (int *)&local_49c,&local_34c,(int *)0x0,(int *)0x0);
              local_3fc = uVar77;
              if (uVar77 != 0) {
                iVar78 = ((int)local_3d0 - (int)local_470) + 1;
                if ((iVar78 != 0) && (0 < (int)uVar112)) {
                  local_2e8 = local_390 + (ulong)uVar127 * lVar117 + (ulong)uVar66;
                  local_428 = (ulong)(uint)((int)local_428 - local_488._0_4_);
                  local_3d0 = (ulong)(uint)((int)local_3d0 - (int)local_470);
                  lVar110 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                  local_498._0_4_ = local_49c;
                  local_404 = local_34c;
                  lVar99 = 0;
                  uVar77 = 0;
                  do {
                    uVar77 = uVar77 + (*(char *)(lVar110 + 0xc + lVar99) == '\x01');
                    lVar99 = lVar99 + 0xe;
                  } while ((ulong)uVar112 * 0xe != lVar99);
                  if ((uVar77 != 0) &&
                     (local_420 = ImGui::MemAlloc((ulong)uVar77 * 4), local_420 != (void *)0x0)) {
                    uVar171 = 0;
                    bVar90 = false;
                    iVar79 = 0;
                    local_450 = (ImFontConfig *)0x0;
                    iVar95 = 0;
                    bVar65 = true;
                    do {
                      bVar98 = bVar65;
                      if ((bVar90) &&
                         (local_450 = (ImFontConfig *)ImGui::MemAlloc((long)iVar95 << 3),
                         local_450 == (ImFontConfig *)0x0)) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(local_420);
                        goto LAB_0015121e;
                      }
                      local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                      fVar130 = 0.0;
                      fVar103 = 0.0;
                      uVar116 = 0xffffffff;
                      lVar99 = 0;
                      do {
                        iVar95 = (int)local_238[0].data;
                        switch(*(undefined1 *)(lVar110 + 0xc + lVar99)) {
                        case 1:
                          if (-1 < (int)uVar116) {
                            *(int *)((long)local_420 + (ulong)uVar116 * 4) =
                                 (int)local_238[0].data - iVar79;
                          }
                          uVar116 = uVar116 + 1;
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar99)),
                                             ZEXT416(*(uint *)(lVar110 + lVar99)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar103 = (float)(auVar131._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          iVar79 = iVar95;
                          if (local_450 != (ImFontConfig *)0x0) {
                            *(float *)(local_450->Name + (long)iVar95 * 8 + -0x56) = fVar130;
                            *(float *)(local_450->Name + (long)iVar95 * 8 + -0x56 + 4) = fVar103;
                          }
                          break;
                        case 2:
                          lVar97 = (long)(int)local_238[0].data;
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar99)),
                                             ZEXT416(*(uint *)(lVar110 + lVar99)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar103 = (float)(auVar131._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          if (local_450 != (ImFontConfig *)0x0) {
                            *(float *)(local_450->Name + lVar97 * 8 + -0x56) = fVar130;
                            *(float *)(local_450->Name + lVar97 * 8 + -0x56 + 4) = fVar103;
                          }
                          break;
                        case 3:
                          fVar156 = (float)(int)*(short *)(lVar110 + 6 + lVar99);
                          auVar145 = ZEXT416((uint)fVar156);
                          stbtt__tesselate_curve
                                    ((stbtt__point *)local_450,(int *)local_238,fVar130,fVar103,
                                     (float)(int)*(short *)(lVar110 + 4 + lVar99),fVar156,
                                     (float)(int)*(short *)(lVar110 + lVar99),
                                     (float)(int)*(short *)(lVar110 + 2 + lVar99),local_3c4,0);
                          goto LAB_001504db;
                        case 4:
                          fVar156 = (float)(int)*(short *)(lVar110 + 6 + lVar99);
                          auVar145 = ZEXT416((uint)fVar156);
                          stbtt__tesselate_cubic
                                    ((stbtt__point *)local_450,(int *)local_238,fVar130,fVar103,
                                     (float)(int)*(short *)(lVar110 + 4 + lVar99),fVar156,
                                     (float)(int)*(short *)(lVar110 + 8 + lVar99),
                                     (float)(int)*(short *)(lVar110 + 10 + lVar99),
                                     (float)(int)*(short *)(lVar110 + lVar99),
                                     (float)(int)*(short *)(lVar110 + 2 + lVar99),local_3c4,0);
LAB_001504db:
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar99)),
                                             ZEXT416(*(uint *)(lVar110 + lVar99)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar103 = (float)(auVar131._4_4_ >> 0x10);
                        }
                        pIVar101 = local_450;
                        lVar99 = lVar99 + 0xe;
                      } while ((ulong)uVar112 * 0xe != lVar99);
                      *(int *)((long)local_420 + (long)(int)uVar116 * 4) =
                           (int)local_238[0].data - iVar79;
                      bVar90 = true;
                      iVar95 = (int)local_238[0].data;
                      bVar65 = false;
                    } while (bVar98);
                    if (local_450 != (ImFontConfig *)0x0) {
                      lVar110 = 0;
                      lVar99 = 0;
                      do {
                        lVar99 = (long)(int)lVar99 + (long)*(int *)((long)local_420 + lVar110 * 4);
                        lVar110 = lVar110 + 1;
                      } while (CONCAT44(uVar171,uVar77) != lVar110);
                      local_438 = (stbtt__edge *)ImGui::MemAlloc(lVar99 * 0x14 + 0x14);
                      if (local_438 != (stbtt__edge *)0x0) {
                        lVar110 = 0;
                        uVar112 = 0;
                        iVar95 = 0;
                        do {
                          iVar79 = *(int *)((long)local_420 + lVar110 * 4);
                          if (0 < iVar79) {
                            lVar99 = (long)iVar95;
                            uVar96 = (ulong)(iVar79 - 1);
                            uVar80 = 0;
                            iVar159 = iVar79;
                            do {
                              iVar113 = (int)uVar96;
                              fVar130 = *(float *)(local_450->Name +
                                                  (long)iVar113 * 8 + lVar99 * 8 + -0x52);
                              fVar103 = *(float *)(pIVar101->Name + uVar80 * 8 + lVar99 * 8 + -0x52)
                              ;
                              if ((fVar130 != fVar103) || (NAN(fVar130) || NAN(fVar103))) {
                                iVar114 = (int)uVar80;
                                iVar159 = iVar113;
                                if (fVar130 <= fVar103) {
                                  iVar159 = iVar114;
                                  iVar114 = iVar113;
                                }
                                local_438[(int)uVar112].invert = (uint)(fVar103 < fVar130);
                                uVar173 = *(undefined8 *)
                                           (local_450->Name + (long)iVar159 * 8 + lVar99 * 8 + -0x56
                                           );
                                uVar192 = *(undefined8 *)
                                           (local_450->Name + (long)iVar114 * 8 + lVar99 * 8 + -0x56
                                           );
                                psVar105 = local_438 + (int)uVar112;
                                psVar105->x0 = (float)uVar173 * (float)local_248._0_4_ + 0.0;
                                psVar105->y0 = (float)((ulong)uVar173 >> 0x20) *
                                               (float)local_248._4_4_ + 0.0;
                                psVar105->x1 = (float)uVar192 * fStack_240 + 0.0;
                                psVar105->y1 = (float)((ulong)uVar192 >> 0x20) * fStack_23c + 0.0;
                                uVar112 = uVar112 + 1;
                                iVar159 = *(int *)((long)local_420 + lVar110 * 4);
                              }
                              uVar96 = uVar80 & 0xffffffff;
                              uVar80 = uVar80 + 1;
                            } while ((long)uVar80 < (long)iVar159);
                          }
                          iVar95 = iVar95 + iVar79;
                          lVar110 = lVar110 + 1;
                        } while (lVar110 != CONCAT44(uVar171,uVar77));
                        stbtt__sort_edges_quicksort(local_438,uVar112);
                        if (1 < (int)uVar112) {
                          uVar80 = 1;
                          lVar110 = 2;
                          psVar105 = local_438;
                          do {
                            uVar2 = local_438[uVar80].x0;
                            uVar3 = local_438[uVar80].y0;
                            iVar95 = local_438[uVar80].invert;
                            local_238[0].cursor = iVar95;
                            local_238[0].data = *(uchar **)&local_438[uVar80].x1;
                            lVar99 = lVar110;
                            psVar111 = psVar105;
                            do {
                              if (psVar111->y0 <= (float)uVar3) {
                                uVar77 = (int)lVar99 - 1;
                                goto LAB_00150730;
                              }
                              psVar111[1].invert = psVar111->invert;
                              fVar130 = psVar111->y0;
                              fVar103 = psVar111->x1;
                              fVar156 = psVar111->y1;
                              psVar111[1].x0 = psVar111->x0;
                              psVar111[1].y0 = fVar130;
                              psVar111[1].x1 = fVar103;
                              psVar111[1].y1 = fVar156;
                              lVar99 = lVar99 + -1;
                              psVar111 = psVar111 + -1;
                            } while (1 < lVar99);
                            uVar77 = 0;
LAB_00150730:
                            if (uVar80 != uVar77) {
                              local_438[(int)uVar77].x0 = (float)uVar2;
                              local_438[(int)uVar77].y0 = (float)uVar3;
                              *(uchar **)&local_438[(int)uVar77].x1 = local_238[0].data;
                              local_438[(int)uVar77].invert = iVar95;
                            }
                            uVar80 = uVar80 + 1;
                            lVar110 = lVar110 + 1;
                            psVar105 = psVar105 + 1;
                          } while (uVar80 != uVar112);
                        }
                        local_448 = (undefined1  [8])0x0;
                        scanline = local_238;
                        if (0x3f < (int)(uint)local_428) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        }
                        local_438[(int)uVar112].y0 = (float)(iVar78 + local_404) + 1.0;
                        if ((uint)local_3d0 < 0x7fffffff) {
                          local_300 = (long)(int)local_3fc;
                          local_35c = (float)(int)local_498._0_4_;
                          local_370 = (float *)((long)&scanline->data + local_300 * 4);
                          local_328 = local_370 + 1;
                          local_2f0 = local_300 * 4;
                          local_2f8 = (long)(int)(uint)local_428 * 4 + 8;
                          local_400 = (float)(int)local_3fc;
                          local_388 = 0;
                          local_380 = 0;
                          local_3b0 = (undefined8 *)0x0;
                          local_3c8 = 0;
                          local_418 = (stbtt__active_edge *)0x0;
                          auVar86 = (undefined1  [8])(stbtt__active_edge *)0x0;
                          psVar105 = local_438;
                          iVar78 = local_404;
                          do {
                            local_368 = iVar78;
                            iVar78 = local_404;
                            fVar130 = (float)local_368;
                            fVar103 = fVar130 + 1.0;
                            memset(scanline,0,local_2f0);
                            memset(local_370,0,local_2f8);
                            if (auVar86 != (undefined1  [8])0x0) {
                              psVar88 = (stbtt__active_edge *)local_448;
                              do {
                                if (((stbtt__active_edge *)auVar86)->ey <= fVar130) {
                                  psVar88->next = ((stbtt__active_edge *)auVar86)->next;
                                  if ((((stbtt__active_edge *)auVar86)->direction == 0.0) &&
                                     (!NAN(((stbtt__active_edge *)auVar86)->direction))) {
                                    __assert_fail("z->direction",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                  ,0xc63,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  ((stbtt__active_edge *)auVar86)->direction = 0.0;
                                  ((stbtt__active_edge *)auVar86)->next = local_418;
                                  local_418 = (stbtt__active_edge *)auVar86;
                                  auVar86 = (undefined1  [8])psVar88;
                                }
                                ppsVar64 = &((stbtt__active_edge *)auVar86)->next;
                                psVar88 = (stbtt__active_edge *)auVar86;
                                auVar86 = (undefined1  [8])*ppsVar64;
                              } while (*ppsVar64 != (stbtt__active_edge *)0x0);
                            }
                            fVar156 = psVar105->y0;
                            if (fVar156 <= fVar103) {
                              bVar65 = (int)local_380 == 0;
                              do {
                                psVar88 = local_418;
                                fVar157 = psVar105->y1;
                                if ((fVar156 != fVar157) || (NAN(fVar156) || NAN(fVar157))) {
                                  if (local_418 == (stbtt__active_edge *)0x0) {
                                    if (local_3c8 == 0) {
                                      puVar87 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar87 == (undefined8 *)0x0) {
                                        __assert_fail("z != __null",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                  ,0xad1,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                      }
                                      *puVar87 = local_3b0;
                                      fVar156 = psVar105->y0;
                                      fVar157 = psVar105->y1;
                                      local_3c8 = 799;
                                    }
                                    else {
                                      local_3c8 = local_3c8 + -1;
                                      puVar87 = local_3b0;
                                    }
                                    local_3b0 = puVar87;
                                    psVar88 = (stbtt__active_edge *)
                                              (puVar87 + (long)local_3c8 * 4 + 1);
                                    local_418 = (stbtt__active_edge *)0x0;
                                  }
                                  else {
                                    local_418 = local_418->next;
                                  }
                                  fVar158 = psVar105->x0;
                                  fVar160 = (psVar105->x1 - fVar158) / (fVar157 - fVar156);
                                  psVar88->fdx = fVar160;
                                  psVar88->fdy = (float)(-(uint)(fVar160 != 0.0) &
                                                        (uint)(1.0 / fVar160));
                                  psVar88->fx = ((fVar130 - fVar156) * fVar160 + fVar158) -
                                                local_35c;
                                  psVar88->direction =
                                       *(float *)(&DAT_0019d43c + (ulong)(psVar105->invert == 0) * 4
                                                 );
                                  psVar88->sy = fVar156;
                                  psVar88->ey = fVar157;
                                  psVar88->next = (stbtt__active_edge *)0x0;
                                  if (fVar157 < fVar130 && (bVar65 && iVar78 != 0)) {
                                    psVar88->ey = fVar130;
                                    fVar157 = fVar130;
                                  }
                                  if (fVar157 < fVar130) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                  ,0xc76,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar88->next = (stbtt__active_edge *)local_448;
                                  local_448 = (undefined1  [8])psVar88;
                                }
                                else {
                                }
                                fVar156 = psVar105[1].y0;
                                psVar105 = psVar105 + 1;
                              } while (fVar156 <= fVar103);
                            }
                            if (local_448 != (undefined1  [8])0x0) {
                              local_2c8 = psVar105;
                              auVar86 = local_448;
                              do {
                                fVar156 = ((stbtt__active_edge *)auVar86)->ey;
                                if (fVar156 < fVar130) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                ,0xba5,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar157 = ((stbtt__active_edge *)auVar86)->fx;
                                auVar203._0_8_ = CONCAT44(0,fVar157);
                                auVar203._8_8_ = 0;
                                fVar158 = ((stbtt__active_edge *)auVar86)->fdx;
                                if ((fVar158 != 0.0) || (NAN(fVar158))) {
                                  fVar160 = ((stbtt__active_edge *)auVar86)->sy;
                                  if (fVar103 < fVar160) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                  ,3000,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar167 = fVar158 + fVar157;
                                  fVar165 = (float)(~-(uint)(fVar130 < fVar160) & (uint)fVar157 |
                                                   (uint)((fVar160 - fVar130) * fVar158 + fVar157) &
                                                   -(uint)(fVar130 < fVar160));
                                  if ((((fVar165 < 0.0) ||
                                       (fVar168 = (float)(~-(uint)(fVar156 < fVar103) &
                                                          (uint)fVar167 |
                                                         (uint)((fVar156 - fVar130) * fVar158 +
                                                               fVar157) & -(uint)(fVar156 < fVar103)
                                                         ), fVar168 < 0.0)) ||
                                      (local_400 <= fVar165)) || (local_400 <= fVar168)) {
                                    if ((uint)local_428 < 0x7fffffff) {
                                      local_3e8 = ZEXT416((uint)fVar167);
                                      local_358 = fVar158;
                                      local_348 = auVar203;
                                      uVar112 = 0;
                                      do {
                                        fVar158 = (float)(int)uVar112;
                                        uVar77 = uVar112 + 1;
                                        fVar156 = (float)(int)uVar77;
                                        fVar157 = local_348._0_4_;
                                        fVar160 = (fVar158 - fVar157) / local_358 + fVar130;
                                        fVar165 = (fVar156 - fVar157) / local_358 + fVar130;
                                        fVar167 = local_3e8._0_4_;
                                        if ((fVar158 <= fVar157) || (fVar167 <= fVar156)) {
                                          if ((fVar158 <= fVar167) || (fVar157 <= fVar156)) {
                                            fVar168 = fVar130;
                                            if (((fVar158 <= fVar157) || (fVar167 <= fVar158)) &&
                                               ((fVar158 <= fVar167 || (fVar157 <= fVar158)))) {
                                              if (((fVar157 < fVar156) && (fVar156 < fVar167)) ||
                                                 ((fVar158 = fVar157, fVar160 = fVar130,
                                                  fVar167 < fVar156 && (fVar156 < fVar157)))) {
                                                local_498._0_4_ = fVar156;
                                                fVar158 = fVar130;
                                                fVar160 = fVar165;
                                                goto LAB_00150d87;
                                              }
                                              goto LAB_00150e3b;
                                            }
                                          }
                                          else {
                                            local_498._0_4_ = fVar156;
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar112,
                                                       (stbtt__active_edge *)auVar86,fVar157,fVar130
                                                       ,fVar156,fVar165);
                                            fVar157 = (float)local_498._0_4_;
                                            fVar168 = fVar165;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar112,
                                                     (stbtt__active_edge *)auVar86,fVar157,fVar168,
                                                     fVar158,fVar160);
                                        }
                                        else {
                                          local_498._0_4_ = fVar156;
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar112,
                                                     (stbtt__active_edge *)auVar86,fVar157,fVar130,
                                                     fVar158,fVar160);
                                          fVar157 = fVar158;
                                          fVar156 = (float)local_498._0_4_;
                                          fVar158 = fVar160;
                                          fVar160 = fVar165;
LAB_00150d87:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar112,
                                                     (stbtt__active_edge *)auVar86,fVar157,fVar158,
                                                     fVar156,fVar160);
                                          fVar158 = (float)local_498._0_4_;
                                        }
LAB_00150e3b:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar112,
                                                   (stbtt__active_edge *)auVar86,fVar158,fVar160,
                                                   local_3e8._0_4_,fVar103);
                                        uVar112 = uVar77;
                                      } while (local_3fc != uVar77);
                                    }
                                  }
                                  else {
                                    if (fVar160 <= fVar130) {
                                      fVar160 = fVar130;
                                    }
                                    uVar112 = (uint)fVar165;
                                    if (fVar103 <= fVar156) {
                                      fVar156 = fVar103;
                                    }
                                    uVar77 = (uint)fVar168;
                                    if (uVar112 == uVar77) {
                                      if (((int)uVar112 < 0) ||
                                         ((int)(uint)local_428 < (int)uVar112)) {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar80 = (ulong)uVar112;
                                      *(float *)((long)&scanline->data + uVar80 * 4) =
                                           (((fVar168 - (float)(int)uVar112) +
                                            (fVar165 - (float)(int)uVar112)) * -0.5 + 1.0) *
                                           ((stbtt__active_edge *)auVar86)->direction *
                                           (fVar156 - fVar160) +
                                           *(float *)((long)&scanline->data + uVar80 * 4);
                                      fVar157 = (fVar156 - fVar160) *
                                                ((stbtt__active_edge *)auVar86)->direction;
                                    }
                                    else {
                                      fVar158 = ((stbtt__active_edge *)auVar86)->fdy;
                                      uVar116 = uVar112;
                                      fVar170 = fVar165;
                                      if (fVar168 < fVar165) {
                                        fVar157 = fVar130 - fVar160;
                                        fVar160 = (fVar130 - fVar156) + fVar103;
                                        fVar158 = -fVar158;
                                        uVar116 = uVar77;
                                        uVar77 = uVar112;
                                        fVar156 = fVar157 + fVar103;
                                        fVar170 = fVar168;
                                        fVar168 = fVar165;
                                        fVar157 = fVar167;
                                      }
                                      iVar78 = uVar116 + 1;
                                      fVar167 = ((float)iVar78 - fVar157) * fVar158 + fVar130;
                                      fVar157 = ((stbtt__active_edge *)auVar86)->direction;
                                      fVar165 = (fVar167 - fVar160) * fVar157;
                                      lVar110 = (long)(int)uVar116;
                                      *(float *)((long)&scanline->data + lVar110 * 4) =
                                           (((fVar170 - (float)(int)uVar116) + 1.0) * -0.5 + 1.0) *
                                           fVar165 + *(float *)((long)&scanline->data + lVar110 * 4)
                                      ;
                                      if (uVar77 - iVar78 != 0 && iVar78 <= (int)uVar77) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar110 * 4 + 4) =
                                               fVar158 * fVar157 * 0.5 + fVar165 +
                                               *(float *)((long)&scanline->data + lVar110 * 4 + 4);
                                          fVar165 = fVar165 + fVar158 * fVar157;
                                          lVar110 = lVar110 + 1;
                                        } while (uVar77 - 1 != (int)lVar110);
                                      }
                                      if (1.01 < ABS(fVar165)) {
                                        __assert_fail("fabsf(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar80 = (ulong)(int)uVar77;
                                      *(float *)((long)&scanline->data + uVar80 * 4) =
                                           (fVar156 -
                                           (fVar158 * (float)(int)(uVar77 - iVar78) + fVar167)) *
                                           (((fVar168 - (float)(int)uVar77) + 0.0) * -0.5 + 1.0) *
                                           fVar157 + fVar165 +
                                           *(float *)((long)&scanline->data + uVar80 * 4);
                                      fVar157 = (fVar156 - fVar160) * fVar157;
                                    }
                                    local_328[uVar80] = fVar157 + local_328[uVar80];
                                  }
                                }
                                else if (fVar157 < local_400) {
                                  if (0.0 <= fVar157) {
                                    local_348 = auVar203;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar157,
                                               (stbtt__active_edge *)auVar86,fVar157,fVar130,fVar157
                                               ,fVar103);
                                    iVar78 = (int)fVar157 + 1;
                                    auVar138 = local_348;
                                  }
                                  else {
                                    iVar78 = 0;
                                    auVar138._8_8_ = 0;
                                    auVar138._0_8_ = auVar203._0_8_;
                                  }
                                  stbtt__handle_clipped_edge
                                            (local_370,iVar78,(stbtt__active_edge *)auVar86,
                                             auVar138._0_4_,fVar130,auVar138._0_4_,fVar103);
                                }
                                auVar86 = (undefined1  [8])((stbtt__active_edge *)auVar86)->next;
                                psVar105 = local_2c8;
                              } while (auVar86 != (undefined1  [8])0x0);
                            }
                            uVar112 = (uint)DAT_0019c910;
                            auVar145._0_12_ = ZEXT812(0x437f0000);
                            auVar145._12_4_ = 0.0;
                            auVar86 = local_448;
                            if ((uint)local_428 < 0x7fffffff) {
                              fVar130 = 0.0;
                              psVar89 = scanline;
                              uVar80 = local_388;
                              lVar110 = local_300;
                              do {
                                fVar130 = fVar130 + *(float *)((long)&psVar89->data + local_300 * 4)
                                ;
                                iVar78 = (int)((float)((uint)(*(float *)&psVar89->data + fVar130) &
                                                      uVar112) * 255.0 + 0.5);
                                if (0xfe < iVar78) {
                                  iVar78 = 0xff;
                                }
                                local_2e8[(int)uVar80] = (uchar)iVar78;
                                uVar80 = (ulong)((int)uVar80 + 1);
                                psVar89 = (stbtt__buf *)((long)&psVar89->data + 4);
                                lVar110 = lVar110 + -1;
                              } while (lVar110 != 0);
                            }
                            for (; auVar86 != (undefined1  [8])0x0;
                                auVar86 = (undefined1  [8])((stbtt__active_edge *)auVar86)->next) {
                              ((stbtt__active_edge *)auVar86)->fx =
                                   ((stbtt__active_edge *)auVar86)->fdx +
                                   ((stbtt__active_edge *)auVar86)->fx;
                            }
                            iVar95 = (int)local_380;
                            local_380 = (ulong)(iVar95 + 1);
                            local_388 = (ulong)(uint)((int)local_388 + (int)local_42c);
                            puVar87 = local_3b0;
                            auVar86 = local_448;
                            iVar78 = local_368 + 1;
                          } while (iVar95 != (uint)local_3d0);
                          while (puVar87 != (undefined8 *)0x0) {
                            puVar12 = (undefined8 *)*puVar87;
                            ImGui::MemFree(puVar87);
                            puVar87 = puVar12;
                          }
                        }
                        pIVar101 = local_450;
                        if (scanline != local_238) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(local_438);
                      }
                      ImGui::MemFree(local_420);
                      ImGui::MemFree(pIVar101);
                    }
                  }
                }
              }
LAB_0015121e:
              ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
              uVar80 = (ulong)*(ushort *)(local_378 + 8);
              uVar66 = *(ushort *)(local_378 + 10);
              uVar127 = *(ushort *)(local_378 + 4);
              uVar112 = (uint)uVar127;
              uVar67 = *(ushort *)(local_378 + 6);
              iVar78 = (int)local_470;
              auVar131 = _DAT_001a55b0;
              fVar130 = (float)local_468._0_4_;
              if (1 < (byte)local_318) {
                local_238[0].data = (uchar *)0x0;
                uVar77 = 0;
                if (uVar67 == 0) {
                  uVar67 = 0;
                }
                else {
                  puVar85 = local_390 +
                            (long)(int)((uint)uVar66 * (int)local_42c) +
                            (ulong)*(ushort *)(local_378 + 8);
                  iVar78 = (uint)uVar127 - local_488._0_4_;
                  uVar112 = iVar78 + 1;
                  uVar80 = (ulong)uVar112;
                  do {
                    uVar96 = local_318;
                    memset(local_238,0,local_318);
                    auVar131 = _DAT_001a55b0;
                    uVar171 = local_488._0_4_;
                    uVar116 = uVar112;
                    switch((int)uVar96) {
                    case 2:
                      if (iVar78 < 0) {
LAB_0015152f:
                        uVar96 = 0;
                        uVar116 = 0;
                      }
                      else {
                        uVar107 = 0;
                        uVar96 = 0;
                        do {
                          bVar118 = puVar85[uVar107];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 + 2 & 7)) =
                               bVar118;
                          uVar149 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                          uVar96 = (ulong)uVar149;
                          puVar85[uVar107] = (uchar)(uVar149 >> 1);
                          uVar107 = uVar107 + 1;
                        } while (uVar80 != uVar107);
                      }
                      break;
                    case 3:
                      if (iVar78 < 0) goto LAB_0015152f;
                      uVar107 = 0;
                      uVar96 = 0;
                      do {
                        bVar118 = puVar85[uVar107];
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 + 3 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        puVar85[uVar107] = (uchar)(uVar96 / 3);
                        uVar107 = uVar107 + 1;
                      } while (uVar80 != uVar107);
                      break;
                    case 4:
                      if (iVar78 < 0) goto LAB_0015152f;
                      uVar107 = 0;
                      uVar96 = 0;
                      do {
                        bVar118 = puVar85[uVar107];
                        uVar106 = (ulong)((uint)uVar107 & 7);
                        bVar4 = *(byte *)((long)&local_238[0].data + uVar106);
                        *(byte *)((long)&local_238[0].data + (uVar106 ^ 4)) = bVar118;
                        uVar149 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                        uVar96 = (ulong)uVar149;
                        puVar85[uVar107] = (uchar)(uVar149 >> 2);
                        uVar107 = uVar107 + 1;
                      } while (uVar80 != uVar107);
                      break;
                    case 5:
                      if (iVar78 < 0) goto LAB_0015152f;
                      uVar107 = 0;
                      uVar96 = 0;
                      do {
                        bVar118 = puVar85[uVar107];
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 + 5 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        puVar85[uVar107] = (uchar)(uVar96 / 5);
                        uVar107 = uVar107 + 1;
                      } while (uVar80 != uVar107);
                      break;
                    default:
                      if (iVar78 < 0) {
                        uVar96 = 0;
                        uVar116 = 0;
                      }
                      else {
                        uVar107 = 0;
                        uVar96 = 0;
                        do {
                          bVar118 = puVar85[uVar107];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)(uVar171 + (uint)uVar107 & 7))
                               = bVar118;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                          puVar85[uVar107] = (uchar)(uVar96 / ((ulong)local_488 & 0xffffffff));
                          uVar107 = uVar107 + 1;
                        } while (uVar80 != uVar107);
                      }
                    }
                    if ((int)uVar116 < (int)(uint)uVar127) {
                      uVar107 = (ulong)uVar116;
                      do {
                        if (puVar85[uVar107] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar116 = (int)uVar96 -
                                  (uint)*(byte *)((long)&local_238[0].data +
                                                 (ulong)((uint)uVar107 & 7));
                        uVar96 = (ulong)uVar116;
                        puVar85[uVar107] = (uchar)(uVar116 / (uint)uVar171);
                        uVar107 = uVar107 + 1;
                      } while ((int)uVar107 < (int)(uint)uVar127);
                    }
                    puVar85 = puVar85 + lVar117;
                    uVar77 = uVar77 + 1;
                  } while (uVar77 != uVar67);
                  uVar80 = (ulong)*(ushort *)(local_378 + 8);
                  uVar66 = *(ushort *)(local_378 + 10);
                  uVar112 = (uint)*(ushort *)(local_378 + 4);
                  uVar67 = *(ushort *)(local_378 + 6);
                  iVar78 = (int)local_470;
                  fVar130 = (float)local_468._0_4_;
                }
              }
              sVar91 = (short)uVar80;
              if (1 < (byte)local_320) {
                local_238[0].data = (uchar *)0x0;
                uVar77 = 0;
                if ((short)uVar112 == 0) {
                  uVar112 = 0;
                }
                else {
                  pbVar115 = local_390 + (long)(int)((uint)uVar66 * (int)local_42c) + uVar80;
                  iVar78 = (uint)uVar67 - iVar78;
                  uVar116 = iVar78 + 1;
                  uVar80 = (ulong)uVar116;
                  do {
                    uVar96 = local_320;
                    memset(local_238,0,local_320);
                    auVar131 = _DAT_001a55b0;
                    uVar149 = uVar116;
                    switch((int)uVar96) {
                    case 2:
                      if (iVar78 < 0) {
LAB_001519ac:
                        uVar96 = 0;
                        uVar149 = 0;
                      }
                      else {
                        uVar107 = 0;
                        uVar96 = 0;
                        pbVar109 = pbVar115;
                        do {
                          bVar118 = *pbVar109;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 + 2 & 7)) =
                               bVar118;
                          uVar92 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                          uVar96 = (ulong)uVar92;
                          *pbVar109 = (byte)(uVar92 >> 1);
                          uVar107 = uVar107 + 1;
                          pbVar109 = pbVar109 + lVar117;
                        } while (uVar80 != uVar107);
                      }
                      break;
                    case 3:
                      if (iVar78 < 0) goto LAB_001519ac;
                      uVar107 = 0;
                      uVar96 = 0;
                      pbVar109 = pbVar115;
                      do {
                        bVar118 = *pbVar109;
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 + 3 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        *pbVar109 = (byte)(uVar96 / 3);
                        uVar107 = uVar107 + 1;
                        pbVar109 = pbVar109 + lVar117;
                      } while (uVar80 != uVar107);
                      break;
                    case 4:
                      if (iVar78 < 0) goto LAB_001519ac;
                      uVar107 = 0;
                      uVar96 = 0;
                      pbVar109 = pbVar115;
                      do {
                        bVar118 = *pbVar109;
                        uVar106 = (ulong)((uint)uVar107 & 7);
                        bVar4 = *(byte *)((long)&local_238[0].data + uVar106);
                        *(byte *)((long)&local_238[0].data + (uVar106 ^ 4)) = bVar118;
                        uVar92 = (int)uVar96 + ((uint)bVar118 - (uint)bVar4);
                        uVar96 = (ulong)uVar92;
                        *pbVar109 = (byte)(uVar92 >> 2);
                        uVar107 = uVar107 + 1;
                        pbVar109 = pbVar109 + lVar117;
                      } while (uVar80 != uVar107);
                      break;
                    case 5:
                      if (iVar78 < 0) goto LAB_001519ac;
                      uVar107 = 0;
                      uVar96 = 0;
                      pbVar109 = pbVar115;
                      do {
                        bVar118 = *pbVar109;
                        bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 + 5 & 7)) =
                             bVar118;
                        uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                        *pbVar109 = (byte)(uVar96 / 5);
                        uVar107 = uVar107 + 1;
                        pbVar109 = pbVar109 + lVar117;
                      } while (uVar80 != uVar107);
                      break;
                    default:
                      if (iVar78 < 0) {
                        uVar96 = 0;
                        uVar149 = 0;
                      }
                      else {
                        uVar107 = 0;
                        uVar96 = 0;
                        pbVar109 = pbVar115;
                        do {
                          bVar118 = *pbVar109;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar107 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_470 + (uint)uVar107 & 7)) = bVar118;
                          uVar96 = (ulong)((int)uVar96 + ((uint)bVar118 - (uint)bVar4));
                          *pbVar109 = (byte)(uVar96 / (local_470 & 0xffffffff));
                          uVar107 = uVar107 + 1;
                          pbVar109 = pbVar109 + lVar117;
                        } while (uVar80 != uVar107);
                      }
                    }
                    if ((int)uVar149 < (int)(uint)uVar67) {
                      lVar110 = (long)(int)uVar149;
                      pbVar109 = pbVar115 + lVar117 * lVar110;
                      do {
                        if (*pbVar109 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar96 = (ulong)((int)uVar96 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar110 & 7)));
                        *pbVar109 = (byte)(uVar96 / (local_470 & 0xffffffff));
                        lVar110 = lVar110 + 1;
                        pbVar109 = pbVar109 + lVar117;
                      } while ((uint)uVar67 != (uint)lVar110);
                    }
                    pbVar115 = pbVar115 + 1;
                    uVar77 = uVar77 + 1;
                  } while (uVar77 != uVar112);
                  sVar91 = *(short *)(local_378 + 8);
                  uVar66 = *(ushort *)(local_378 + 10);
                  uVar112 = (uint)*(ushort *)(local_378 + 4);
                  uVar67 = *(ushort *)(local_378 + 6);
                  fVar130 = (float)local_468._0_4_;
                }
              }
              *local_2d8 = sVar91;
              local_2d8[1] = uVar66;
              local_2d8[2] = sVar91 + (short)uVar112;
              local_2d8[3] = uVar67 + uVar66;
              *(float *)(local_2d8 + 8) =
                   (float)(int)(short)((short)(local_360 << 8) + (short)local_364) * fVar130;
              *(ulong *)(local_2d8 + 4) =
                   CONCAT44((float)local_354 * local_268._4_4_ + local_258._4_4_,
                            (float)local_350 * local_268._0_4_ + local_258._0_4_);
              *(float *)(local_2d8 + 10) =
                   (float)(int)(uVar112 + local_350) * local_268._0_4_ + local_258._0_4_;
              *(float *)(local_2d8 + 0xc) =
                   (float)(int)((uint)uVar67 + local_354) * (float)local_278._0_4_ +
                   (float)local_288._0_4_;
              iVar78 = local_3b8[1].fontstart;
              lVar110 = local_2e0;
              lVar99 = local_2d0;
              atlas_00 = local_478;
              psVar100 = local_3b8;
            }
            lVar99 = lVar99 + 1;
          } while (lVar99 < iVar78);
        }
        fVar130 = local_308[local_3c0].RasterizerMultiply;
        _local_488 = ZEXT416((uint)fVar130);
        if ((fVar130 != 1.0) || (NAN(fVar130))) {
          local_488._4_4_ = fVar130;
          local_488._0_4_ = fVar130;
          fStack_480 = fVar130;
          fStack_47c = fVar130;
          lVar110 = 0;
          uVar112 = 0xc;
          uVar77 = 0xd;
          uVar116 = 0xe;
          uVar149 = 0xf;
          auVar134 = _DAT_001a5540;
          auVar139 = _DAT_001a5530;
          auVar146 = _DAT_001a5520;
          do {
            uVar137 = auVar139._0_4_;
            uVar141 = auVar139._4_4_;
            uVar142 = auVar139._12_4_;
            uVar166 = auVar139._8_4_;
            uVar92 = auVar134._0_4_;
            uVar135 = auVar134._4_4_;
            uVar136 = auVar134._12_4_;
            uVar179 = auVar134._8_4_;
            uVar143 = auVar146._0_4_;
            uVar147 = auVar146._4_4_;
            uVar148 = auVar146._12_4_;
            uVar199 = auVar146._8_4_;
            fVar182 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar143 & 0xffff | 0x4b000000)) * fVar130;
            fVar186 = (((float)(uVar147 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar147 & 0xffff | 0x4b000000)) * fVar130;
            fVar187 = (((float)(uVar199 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar199 & 0xffff | 0x4b000000)) * fVar130;
            fVar188 = (((float)(uVar148 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar148 & 0xffff | 0x4b000000)) * fVar130;
            fVar170 = (((float)(uVar112 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar112 & 0xffff | 0x4b000000)) * fVar130;
            fVar178 = (((float)(uVar77 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar77 & 0xffff | 0x4b000000)) * fVar130;
            fVar180 = (((float)(uVar116 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar116 & 0xffff | 0x4b000000)) * fVar130;
            fVar181 = (((float)(uVar149 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar149 & 0xffff | 0x4b000000)) * fVar130;
            fVar160 = (((float)(uVar92 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar92 & 0xffff | 0x4b000000)) * fVar130;
            fVar165 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar130;
            fVar167 = (((float)(uVar179 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar179 & 0xffff | 0x4b000000)) * fVar130;
            fVar168 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar130;
            fVar103 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar130;
            fVar156 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar141 & 0xffff | 0x4b000000)) * fVar130;
            fVar157 = (((float)(uVar166 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar166 & 0xffff | 0x4b000000)) * fVar130;
            fVar158 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar142 & 0xffff | 0x4b000000)) * fVar130;
            auVar155._0_4_ = (int)fVar103;
            auVar155._4_4_ = (int)fVar156;
            auVar155._8_4_ = (int)fVar157;
            auVar155._12_4_ = (int)fVar158;
            auVar200._0_4_ = auVar155._0_4_ >> 0x1f;
            auVar200._4_4_ = auVar155._4_4_ >> 0x1f;
            auVar200._8_4_ = auVar155._8_4_ >> 0x1f;
            auVar200._12_4_ = auVar155._12_4_ >> 0x1f;
            auVar154._0_4_ = (int)(fVar103 - 2.1474836e+09);
            auVar154._4_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar154._8_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar154._12_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar155 = auVar154 & auVar200 | auVar155;
            auVar164._0_4_ = (int)fVar160;
            auVar164._4_4_ = (int)fVar165;
            auVar164._8_4_ = (int)fVar167;
            auVar164._12_4_ = (int)fVar168;
            auVar201._0_4_ = auVar164._0_4_ >> 0x1f;
            auVar201._4_4_ = auVar164._4_4_ >> 0x1f;
            auVar201._8_4_ = auVar164._8_4_ >> 0x1f;
            auVar201._12_4_ = auVar164._12_4_ >> 0x1f;
            auVar163._0_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar163._4_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar163._8_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar163._12_4_ = (int)(fVar168 - 2.1474836e+09);
            auVar164 = auVar163 & auVar201 | auVar164;
            auVar196._0_4_ = (int)fVar170;
            auVar196._4_4_ = (int)fVar178;
            auVar196._8_4_ = (int)fVar180;
            auVar196._12_4_ = (int)fVar181;
            auVar205._0_4_ = auVar196._0_4_ >> 0x1f;
            auVar205._4_4_ = auVar196._4_4_ >> 0x1f;
            auVar205._8_4_ = auVar196._8_4_ >> 0x1f;
            auVar205._12_4_ = auVar196._12_4_ >> 0x1f;
            auVar195._0_4_ = (int)(fVar170 - 2.1474836e+09);
            auVar195._4_4_ = (int)(fVar178 - 2.1474836e+09);
            auVar195._8_4_ = (int)(fVar180 - 2.1474836e+09);
            auVar195._12_4_ = (int)(fVar181 - 2.1474836e+09);
            auVar196 = auVar195 & auVar205 | auVar196;
            auVar184._0_4_ = (int)fVar182;
            auVar184._4_4_ = (int)fVar186;
            auVar184._8_4_ = (int)fVar187;
            auVar184._12_4_ = (int)fVar188;
            auVar202._0_4_ = auVar184._0_4_ >> 0x1f;
            auVar202._4_4_ = auVar184._4_4_ >> 0x1f;
            auVar202._8_4_ = auVar184._8_4_ >> 0x1f;
            auVar202._12_4_ = auVar184._12_4_ >> 0x1f;
            auVar183._0_4_ = (int)(fVar182 - 2.1474836e+09);
            auVar183._4_4_ = (int)(fVar186 - 2.1474836e+09);
            auVar183._8_4_ = (int)(fVar187 - 2.1474836e+09);
            auVar183._12_4_ = (int)(fVar188 - 2.1474836e+09);
            auVar184 = auVar183 & auVar202 | auVar184;
            auVar203 = auVar184 ^ _DAT_0019c8b0;
            auVar176._0_4_ = -(uint)(auVar203._0_4_ < -0x7fffff01);
            auVar176._4_4_ = -(uint)(auVar203._4_4_ < -0x7fffff01);
            auVar176._8_4_ = -(uint)(auVar203._8_4_ < -0x7fffff01);
            auVar176._12_4_ = -(uint)(auVar203._12_4_ < -0x7fffff01);
            auVar203 = ~auVar176 & auVar131 | auVar184 & auVar176;
            auVar133 = auVar196 ^ _DAT_0019c8b0;
            auVar204._0_4_ = -(uint)(auVar133._0_4_ < -0x7fffff01);
            auVar204._4_4_ = -(uint)(auVar133._4_4_ < -0x7fffff01);
            auVar204._8_4_ = -(uint)(auVar133._8_4_ < -0x7fffff01);
            auVar204._12_4_ = -(uint)(auVar133._12_4_ < -0x7fffff01);
            auVar133 = ~auVar204 & auVar131 | auVar196 & auVar204;
            sVar91 = auVar203._0_2_;
            cVar15 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[0] - (0xff < sVar91);
            sVar91 = auVar203._2_2_;
            sVar169 = CONCAT11((0 < sVar91) * (sVar91 < 0x100) * auVar203[2] - (0xff < sVar91),
                               cVar15);
            sVar91 = auVar203._4_2_;
            cVar125 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[4] - (0xff < sVar91);
            sVar91 = auVar203._6_2_;
            uVar171 = CONCAT13((0 < sVar91) * (sVar91 < 0x100) * auVar203[6] - (0xff < sVar91),
                               CONCAT12(cVar125,sVar169));
            sVar91 = auVar203._8_2_;
            cVar16 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[8] - (0xff < sVar91);
            sVar91 = auVar203._10_2_;
            uVar172 = CONCAT15((0 < sVar91) * (sVar91 < 0x100) * auVar203[10] - (0xff < sVar91),
                               CONCAT14(cVar16,uVar171));
            sVar91 = auVar203._12_2_;
            cVar17 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[0xc] - (0xff < sVar91);
            sVar91 = auVar203._14_2_;
            uVar173 = CONCAT17((0 < sVar91) * (sVar91 < 0x100) * auVar203[0xe] - (0xff < sVar91),
                               CONCAT16(cVar17,uVar172));
            sVar91 = auVar133._0_2_;
            cVar18 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[0] - (0xff < sVar91);
            sVar91 = auVar133._2_2_;
            auVar174._0_10_ =
                 CONCAT19((0 < sVar91) * (sVar91 < 0x100) * auVar133[2] - (0xff < sVar91),
                          CONCAT18(cVar18,uVar173));
            sVar91 = auVar133._4_2_;
            cVar19 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[4] - (0xff < sVar91);
            auVar174[10] = cVar19;
            sVar91 = auVar133._6_2_;
            auVar174[0xb] = (0 < sVar91) * (sVar91 < 0x100) * auVar133[6] - (0xff < sVar91);
            sVar91 = auVar133._8_2_;
            cVar128 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[8] - (0xff < sVar91);
            auVar175[0xc] = cVar128;
            auVar175._0_12_ = auVar174;
            sVar91 = auVar133._10_2_;
            auVar175[0xd] = (0 < sVar91) * (sVar91 < 0x100) * auVar133[10] - (0xff < sVar91);
            sVar91 = auVar133._12_2_;
            cVar126 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[0xc] - (0xff < sVar91);
            auVar177[0xe] = cVar126;
            auVar177._0_14_ = auVar175;
            sVar91 = auVar133._14_2_;
            auVar177[0xf] = (0 < sVar91) * (sVar91 < 0x100) * auVar133[0xe] - (0xff < sVar91);
            auVar203 = auVar164 ^ _DAT_0019c8b0;
            auVar197._0_4_ = -(uint)(auVar203._0_4_ < -0x7fffff01);
            auVar197._4_4_ = -(uint)(auVar203._4_4_ < -0x7fffff01);
            auVar197._8_4_ = -(uint)(auVar203._8_4_ < -0x7fffff01);
            auVar197._12_4_ = -(uint)(auVar203._12_4_ < -0x7fffff01);
            auVar133 = ~auVar197 & auVar131 | auVar164 & auVar197;
            auVar203 = auVar155 ^ _DAT_0019c8b0;
            auVar185._0_4_ = -(uint)(auVar203._0_4_ < -0x7fffff01);
            auVar185._4_4_ = -(uint)(auVar203._4_4_ < -0x7fffff01);
            auVar185._8_4_ = -(uint)(auVar203._8_4_ < -0x7fffff01);
            auVar185._12_4_ = -(uint)(auVar203._12_4_ < -0x7fffff01);
            auVar203 = ~auVar185 & auVar131 | auVar155 & auVar185;
            sVar91 = auVar133._0_2_;
            cVar20 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[0] - (0xff < sVar91);
            sVar91 = auVar133._2_2_;
            sVar189 = CONCAT11((0 < sVar91) * (sVar91 < 0x100) * auVar133[2] - (0xff < sVar91),
                               cVar20);
            sVar91 = auVar133._4_2_;
            cVar21 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[4] - (0xff < sVar91);
            sVar91 = auVar133._6_2_;
            uVar190 = CONCAT13((0 < sVar91) * (sVar91 < 0x100) * auVar133[6] - (0xff < sVar91),
                               CONCAT12(cVar21,sVar189));
            sVar91 = auVar133._8_2_;
            cVar22 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[8] - (0xff < sVar91);
            sVar91 = auVar133._10_2_;
            uVar191 = CONCAT15((0 < sVar91) * (sVar91 < 0x100) * auVar133[10] - (0xff < sVar91),
                               CONCAT14(cVar22,uVar190));
            sVar91 = auVar133._12_2_;
            cVar23 = (0 < sVar91) * (sVar91 < 0x100) * auVar133[0xc] - (0xff < sVar91);
            sVar91 = auVar133._14_2_;
            uVar192 = CONCAT17((0 < sVar91) * (sVar91 < 0x100) * auVar133[0xe] - (0xff < sVar91),
                               CONCAT16(cVar23,uVar191));
            sVar91 = auVar203._0_2_;
            cVar24 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[0] - (0xff < sVar91);
            sVar91 = auVar203._2_2_;
            auVar193._0_10_ =
                 CONCAT19((0 < sVar91) * (sVar91 < 0x100) * auVar203[2] - (0xff < sVar91),
                          CONCAT18(cVar24,uVar192));
            sVar91 = auVar203._4_2_;
            cVar25 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[4] - (0xff < sVar91);
            auVar193[10] = cVar25;
            sVar91 = auVar203._6_2_;
            auVar193[0xb] = (0 < sVar91) * (sVar91 < 0x100) * auVar203[6] - (0xff < sVar91);
            sVar91 = auVar203._8_2_;
            cVar26 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[8] - (0xff < sVar91);
            auVar194[0xc] = cVar26;
            auVar194._0_12_ = auVar193;
            sVar91 = auVar203._10_2_;
            auVar194[0xd] = (0 < sVar91) * (sVar91 < 0x100) * auVar203[10] - (0xff < sVar91);
            sVar91 = auVar203._12_2_;
            cVar27 = (0 < sVar91) * (sVar91 < 0x100) * auVar203[0xc] - (0xff < sVar91);
            auVar198[0xe] = cVar27;
            auVar198._0_14_ = auVar194;
            sVar91 = auVar203._14_2_;
            auVar198[0xf] = (0 < sVar91) * (sVar91 < 0x100) * auVar203[0xe] - (0xff < sVar91);
            sVar91 = (short)((uint)uVar190 >> 0x10);
            sVar68 = (short)((uint6)uVar191 >> 0x20);
            sVar129 = (short)((ulong)uVar192 >> 0x30);
            sVar28 = (short)((unkuint10)auVar193._0_10_ >> 0x40);
            sVar29 = auVar193._10_2_;
            sVar30 = auVar194._12_2_;
            sVar31 = auVar198._14_2_;
            sVar32 = (short)((uint)uVar171 >> 0x10);
            sVar33 = (short)((uint6)uVar172 >> 0x20);
            sVar34 = (short)((ulong)uVar173 >> 0x30);
            sVar35 = (short)((unkuint10)auVar174._0_10_ >> 0x40);
            sVar36 = auVar174._10_2_;
            sVar37 = auVar175._12_2_;
            sVar38 = auVar177._14_2_;
            *(char *)((long)&local_238[0].data + lVar110) =
                 (0 < sVar189) * (sVar189 < 0x100) * cVar20 - (0xff < sVar189);
            *(char *)((long)&local_238[0].data + lVar110 + 1) =
                 (0 < sVar91) * (sVar91 < 0x100) * cVar21 - (0xff < sVar91);
            *(char *)((long)&local_238[0].data + lVar110 + 2) =
                 (0 < sVar68) * (sVar68 < 0x100) * cVar22 - (0xff < sVar68);
            *(char *)((long)&local_238[0].data + lVar110 + 3) =
                 (0 < sVar129) * (sVar129 < 0x100) * cVar23 - (0xff < sVar129);
            *(char *)((long)&local_238[0].data + lVar110 + 4) =
                 (0 < sVar28) * (sVar28 < 0x100) * cVar24 - (0xff < sVar28);
            *(char *)((long)&local_238[0].data + lVar110 + 5) =
                 (0 < sVar29) * (sVar29 < 0x100) * cVar25 - (0xff < sVar29);
            *(char *)((long)&local_238[0].data + lVar110 + 6) =
                 (0 < sVar30) * (sVar30 < 0x100) * cVar26 - (0xff < sVar30);
            *(char *)((long)&local_238[0].data + lVar110 + 7) =
                 (0 < sVar31) * (sVar31 < 0x100) * cVar27 - (0xff < sVar31);
            *(char *)((long)&local_238[0].cursor + lVar110) =
                 (0 < sVar169) * (sVar169 < 0x100) * cVar15 - (0xff < sVar169);
            *(char *)((long)&local_238[0].cursor + lVar110 + 1) =
                 (0 < sVar32) * (sVar32 < 0x100) * cVar125 - (0xff < sVar32);
            *(char *)((long)&local_238[0].cursor + lVar110 + 2) =
                 (0 < sVar33) * (sVar33 < 0x100) * cVar16 - (0xff < sVar33);
            *(char *)((long)&local_238[0].cursor + lVar110 + 3) =
                 (0 < sVar34) * (sVar34 < 0x100) * cVar17 - (0xff < sVar34);
            *(char *)((long)&local_238[0].size + lVar110) =
                 (0 < sVar35) * (sVar35 < 0x100) * cVar18 - (0xff < sVar35);
            *(char *)((long)&local_238[0].size + lVar110 + 1) =
                 (0 < sVar36) * (sVar36 < 0x100) * cVar19 - (0xff < sVar36);
            *(char *)((long)&local_238[0].size + lVar110 + 2) =
                 (0 < sVar37) * (sVar37 < 0x100) * cVar128 - (0xff < sVar37);
            *(char *)((long)&local_238[0].size + lVar110 + 3) =
                 (0 < sVar38) * (sVar38 < 0x100) * cVar126 - (0xff < sVar38);
            lVar110 = lVar110 + 0x10;
            iVar78 = (int)DAT_001a55c0;
            auVar134._0_4_ = uVar92 + iVar78;
            iVar95 = DAT_001a55c0._4_4_;
            auVar134._4_4_ = uVar135 + iVar95;
            iVar79 = DAT_001a55c0._8_4_;
            auVar134._8_4_ = uVar179 + iVar79;
            iVar159 = DAT_001a55c0._12_4_;
            auVar134._12_4_ = uVar136 + iVar159;
            auVar139._0_4_ = uVar137 + iVar78;
            auVar139._4_4_ = uVar141 + iVar95;
            auVar139._8_4_ = uVar166 + iVar79;
            auVar139._12_4_ = uVar142 + iVar159;
            auVar146._0_4_ = uVar143 + iVar78;
            auVar146._4_4_ = uVar147 + iVar95;
            auVar146._8_4_ = uVar199 + iVar79;
            auVar146._12_4_ = uVar148 + iVar159;
            uVar112 = uVar112 + iVar78;
            uVar77 = uVar77 + iVar95;
            uVar116 = uVar116 + iVar79;
            uVar149 = uVar149 + iVar159;
          } while (lVar110 != 0x100);
          iVar78 = psVar100[1].cff.cursor;
          if (0 < iVar78) {
            lVar99._0_4_ = psVar100[1].hmtx;
            lVar99._4_4_ = psVar100[1].kern;
            iVar95 = 0;
            do {
              if ((*(int *)(lVar99 + 0xc) != 0) && (*(ushort *)(lVar99 + 6) != 0)) {
                iVar78 = atlas_00->TexWidth;
                uVar66 = *(ushort *)(lVar99 + 4);
                puVar85 = atlas_00->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar99 + 10) * (long)iVar78 +
                          (ulong)*(ushort *)(lVar99 + 8);
                uVar112 = (uint)*(ushort *)(lVar99 + 6);
                do {
                  if ((ulong)uVar66 != 0) {
                    uVar80 = 0;
                    do {
                      puVar85[uVar80] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar85[uVar80]);
                      uVar80 = uVar80 + 1;
                    } while (uVar66 != uVar80);
                  }
                  puVar85 = puVar85 + iVar78;
                  bVar65 = 1 < (int)uVar112;
                  uVar112 = uVar112 - 1;
                } while (bVar65);
                iVar78 = psVar100[1].cff.cursor;
              }
              iVar95 = iVar95 + 1;
              lVar99 = lVar99 + 0x10;
            } while (iVar95 < iVar78);
          }
        }
        psVar100[1].hmtx = 0;
        psVar100[1].kern = 0;
      }
      lVar110 = local_3c0 + 1;
    } while (lVar110 != lVar93);
  }
  ImGui::MemFree(local_440);
  ImGui::MemFree(local_330);
  pvVar84 = pvStack_3f0;
  if (pvStack_3f0 != (void *)0x0) {
    auVar56._8_8_ = 0;
    auVar56._0_8_ = pvStack_3f0;
    _local_3f8 = (stbtt__buf)(auVar56 << 0x40);
    ImGui::MemFree(pvVar84);
    pvStack_3f0._0_4_ = 0;
    pvStack_3f0._4_4_ = 0;
  }
  if (0 < (int)uVar9) {
    lVar110 = 0;
    auVar124._0_12_ = DAT_001a5500._0_12_;
    auVar124._12_2_ = DAT_001a5500._6_2_;
    auVar124._14_2_ = DAT_001a5500._6_2_;
    auVar123._12_4_ = auVar124._12_4_;
    auVar123._0_10_ = (unkbyte10)DAT_001a5500;
    auVar123._10_2_ = DAT_001a5500._4_2_;
    auVar122._10_6_ = auVar123._10_6_;
    auVar122._0_8_ = (undefined8)DAT_001a5500;
    auVar122._8_2_ = DAT_001a5500._4_2_;
    local_498._8_8_ = auVar122._8_8_;
    local_498._6_2_ = DAT_001a5500._2_2_;
    local_498._4_2_ = DAT_001a5500._2_2_;
    local_498._0_2_ = (undefined2)DAT_001a5500;
    local_498._2_2_ = local_498._0_2_;
    pvVar84 = __s;
    do {
      lVar117 = lVar110 * 0x110;
      iVar78 = *(int *)((long)pvVar84 + lVar117 + 0xe8);
      __s = pvVar84;
      if (iVar78 != 0) {
        if ((local_478->ConfigData).Size <= lVar110) goto LAB_001523e2;
        pIVar13 = (local_478->ConfigData).Data;
        pIVar101 = pIVar13 + lVar110;
        pIVar10 = pIVar13[lVar110].DstFont;
        if (pIVar13[lVar110].MergeMode == true) {
          uVar8 = pIVar10->ConfigDataCount;
          sVar91 = uVar8 + 1;
          fVar130 = pIVar10->Ascent;
        }
        else {
          _local_488 = ZEXT416((uint)pIVar13[lVar110].SizePixels);
          lVar99 = *(long *)((long)pvVar84 + lVar117 + 8);
          lVar97 = (long)*(int *)((long)pvVar84 + lVar117 + 0x24);
          bVar118 = *(byte *)(lVar99 + 4 + lVar97);
          bVar4 = *(byte *)(lVar99 + 5 + lVar97);
          bVar5 = *(byte *)(lVar99 + 7 + lVar97);
          bVar6 = *(byte *)(lVar99 + 6 + lVar97);
          ImFont::ClearOutputData(pIVar10);
          iVar78 = (uint)bVar6 * 0x100 + (uint)bVar118;
          auVar45._1_9_ = (unkuint9)0 << 8;
          auVar45[0] = (char)((uint)iVar78 >> 0x10);
          auVar45._10_6_ = 0;
          auVar60._1_12_ = SUB1612(auVar45 << 0x28,4);
          auVar60[0] = (char)((uint)iVar78 >> 8);
          auVar60[0xd] = 0;
          auVar61._1_14_ = auVar60 << 8;
          auVar61[0] = (char)iVar78;
          auVar61[0xf] = 0;
          auVar131 = ZEXT416((uint)bVar4 | (uint)bVar5 << 0x10) | auVar61 << 8;
          sVar68 = auVar131._0_2_;
          sVar91 = auVar131._2_2_;
          fVar103 = (float)((int)sVar68 - (int)sVar91);
          sVar129 = auVar131._4_2_;
          auVar62._4_6_ = 0;
          auVar62._0_4_ = fVar103;
          auVar62._10_2_ = sVar129;
          auVar63._8_4_ = auVar62._8_4_;
          auVar63._6_2_ = sVar91;
          auVar63._4_2_ = (short)((uint)fVar103 >> 0x10);
          auVar63._0_4_ = fVar103;
          auVar140._0_2_ = -(ushort)(sVar68 < (short)local_498._0_2_);
          auVar140._2_2_ = -(ushort)(sVar68 < (short)local_498._2_2_);
          auVar140._4_2_ = -(ushort)(sVar91 < (short)local_498._4_2_);
          auVar140._6_2_ = -(ushort)(sVar91 < (short)local_498._6_2_);
          auVar140._8_2_ = -(ushort)(sVar129 < (short)local_498._8_2_);
          auVar140._10_2_ = -(ushort)(sVar129 < (short)local_498._10_2_);
          auVar140._12_2_ = -(ushort)(0 < (short)local_498._12_2_);
          auVar140._14_2_ = -(ushort)(0 < (short)local_498._14_2_);
          auVar131 = auVar140 & _DAT_0019c930 | ~auVar140 & _DAT_0019c8f0;
          fVar130 = (float)(int)(((float)local_488._0_4_ / fVar103) * (float)(int)sVar68 +
                                auVar131._0_4_);
          pIVar10->FontSize = pIVar101->SizePixels;
          pIVar10->ConfigData = pIVar101;
          pIVar10->ContainerAtlas = local_478;
          pIVar10->Ascent = fVar130;
          pIVar10->Descent =
               (float)(int)(((float)local_488._0_4_ / fVar103) * (float)(auVar63._4_4_ >> 0x10) +
                           auVar131._4_4_);
          iVar78 = *(int *)((long)pvVar84 + lVar117 + 0xe8);
          sVar91 = 1;
        }
        pIVar10->ConfigDataCount = sVar91;
        if (0 < iVar78) {
          local_488._0_4_ = (pIVar101->GlyphOffset).x;
          fVar130 = (float)(int)(fVar130 + 0.5) + (pIVar101->GlyphOffset).y;
          lVar97 = 0;
          lVar99 = 0;
          do {
            if (*(int *)((long)pvVar84 + lVar117 + 0x100) <= lVar99) goto LAB_00152328;
            lVar14 = *(long *)((long)pvVar84 + lVar117 + 0xd0);
            fVar156 = 1.0 / (float)local_478->TexHeight;
            fVar103 = 1.0 / (float)local_478->TexWidth;
            ImFont::AddGlyph(pIVar10,pIVar101,
                             *(ImWchar *)(*(long *)((long)pvVar84 + lVar117 + 0x108) + lVar99 * 4),
                             *(float *)(lVar14 + 8 + lVar97) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar14 + 0xc + lVar97) + 0.0 + fVar130,
                             *(float *)(lVar14 + 0x14 + lVar97) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar14 + 0x18 + lVar97) + 0.0 + fVar130,
                             (float)*(ushort *)(lVar14 + lVar97) * fVar103,
                             (float)*(ushort *)(lVar14 + 2 + lVar97) * fVar156,
                             (float)*(ushort *)(lVar14 + 4 + lVar97) * fVar103,
                             (float)*(ushort *)(lVar14 + 6 + lVar97) * fVar156,
                             *(float *)(lVar14 + 0x10 + lVar97));
            lVar99 = lVar99 + 1;
            lVar97 = lVar97 + 0x1c;
          } while (lVar99 < *(int *)((long)pvVar84 + lVar117 + 0xe8));
        }
      }
      atlas_00 = local_478;
      lVar110 = lVar110 + 1;
      pvVar84 = __s;
    } while (lVar110 != lVar93);
    if (0 < (int)uVar9) {
      sVar102 = 0;
      do {
        pvVar84 = *(void **)((long)__s + sVar102 + 0x108);
        if (pvVar84 != (void *)0x0) {
          ImGui::MemFree(pvVar84);
        }
        pvVar84 = *(void **)((long)__s + sVar102 + 0xf8);
        if (pvVar84 != (void *)0x0) {
          ImGui::MemFree(pvVar84);
        }
        sVar102 = sVar102 + 0x110;
      } while (local_310 != sVar102);
    }
  }
  ImFontAtlasBuildFinish(atlas_00);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  bVar65 = true;
LAB_001522a8:
  if (__s != (void *)0x0) {
    ImGui::MemFree(__s);
  }
  return bVar65;
LAB_00152478:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_0015233d;
LAB_001523e2:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_0015233d;
LAB_00152328:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_0015233d:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,__function);
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}